

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  undefined8 uVar26;
  ulong uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  long lVar76;
  ulong uVar77;
  byte bVar78;
  byte bVar79;
  int iVar80;
  long lVar81;
  bool bVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar163;
  uint uVar164;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar166;
  uint uVar167;
  uint uVar168;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  uint uVar165;
  uint uVar169;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar170;
  float fVar190;
  float fVar191;
  vint4 bi_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar192;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar189 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar196;
  vint4 bi_1;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar209 [16];
  undefined1 auVar213 [32];
  float fVar214;
  float fVar215;
  float fVar231;
  float fVar232;
  vint4 bi;
  undefined1 auVar216 [16];
  float fVar233;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar250 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  vint4 ai;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar265;
  undefined1 auVar262 [32];
  undefined1 auVar261 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  vint4 ai_1;
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  vint4 ai_2;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  float fVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar280;
  undefined1 auVar276 [32];
  float fVar278;
  float fVar279;
  undefined1 auVar277 [64];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar287;
  undefined1 auVar285 [32];
  undefined1 auVar286 [64];
  undefined1 auVar288 [16];
  undefined1 auVar289 [64];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar300;
  undefined1 auVar299 [16];
  float fVar301;
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [32];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 (*local_a50) [32];
  ulong local_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar180 [32];
  
  uVar83 = (ulong)(byte)prim[1];
  lVar76 = uVar83 * 0x25;
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x11 + 6)));
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  fVar2 = *(float *)(prim + lVar76 + 0x12);
  auVar297._4_4_ = fVar2;
  auVar297._0_4_ = fVar2;
  auVar297._8_4_ = fVar2;
  auVar297._12_4_ = fVar2;
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar88 = vsubps_avx(auVar103,*(undefined1 (*) [16])(prim + lVar76 + 6));
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  fVar273 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar76 + 0x16)) *
            *(float *)(prim + lVar76 + 0x1a);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar107 = vpmovsxwd_avx(auVar103);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar283 = vpmovsxwd_avx(auVar102);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar171 = vpmovsxwd_avx(auVar104);
  auVar85 = vpbroadcastd_avx512vl();
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar86 = vpmovsxwd_avx512vl(auVar98);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar87 = vpmovsxwd_avx512vl(auVar3);
  auVar103 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar103 = vinsertps_avx512f(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar299._0_4_ = fVar2 * auVar88._0_4_;
  auVar299._4_4_ = fVar2 * auVar88._4_4_;
  auVar299._8_4_ = fVar2 * auVar88._8_4_;
  auVar299._12_4_ = fVar2 * auVar88._12_4_;
  auVar88 = vmulps_avx512vl(auVar297,auVar103);
  auVar89 = vcvtdq2ps_avx512vl(auVar95);
  auVar90 = vcvtdq2ps_avx512vl(auVar94);
  auVar91 = vcvtdq2ps_avx512vl(auVar91);
  auVar92 = vcvtdq2ps_avx512vl(auVar92);
  auVar93 = vcvtdq2ps_avx512vl(auVar93);
  auVar103 = vcvtdq2ps_avx(auVar96);
  auVar102 = vcvtdq2ps_avx(auVar97);
  auVar104 = vcvtdq2ps_avx(auVar106);
  auVar98 = vcvtdq2ps_avx(auVar105);
  uVar196 = auVar88._0_4_;
  auVar281._4_4_ = uVar196;
  auVar281._0_4_ = uVar196;
  auVar281._8_4_ = uVar196;
  auVar281._12_4_ = uVar196;
  auVar3 = vshufps_avx(auVar88,auVar88,0x55);
  auVar95 = vshufps_avx(auVar88,auVar88,0xaa);
  auVar94 = vmulps_avx512vl(auVar95,auVar91);
  auVar197._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar197._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar197._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar197._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar88._0_4_ = auVar98._0_4_ * auVar95._0_4_;
  auVar88._4_4_ = auVar98._4_4_ * auVar95._4_4_;
  auVar88._8_4_ = auVar98._8_4_ * auVar95._8_4_;
  auVar88._12_4_ = auVar98._12_4_ * auVar95._12_4_;
  auVar95 = vfmadd231ps_avx512vl(auVar94,auVar3,auVar90);
  auVar94 = vfmadd231ps_avx512vl(auVar197,auVar3,auVar93);
  auVar3 = vfmadd231ps_fma(auVar88,auVar104,auVar3);
  auVar96 = vfmadd231ps_avx512vl(auVar95,auVar281,auVar89);
  auVar97 = vfmadd231ps_avx512vl(auVar94,auVar281,auVar92);
  auVar94 = vfmadd231ps_fma(auVar3,auVar102,auVar281);
  auVar295._4_4_ = auVar299._0_4_;
  auVar295._0_4_ = auVar299._0_4_;
  auVar295._8_4_ = auVar299._0_4_;
  auVar295._12_4_ = auVar299._0_4_;
  auVar3 = vshufps_avx(auVar299,auVar299,0x55);
  auVar95 = vshufps_avx(auVar299,auVar299,0xaa);
  auVar91 = vmulps_avx512vl(auVar95,auVar91);
  auVar282._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar282._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar282._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar282._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar234._0_4_ = auVar95._0_4_ * auVar98._0_4_;
  auVar234._4_4_ = auVar95._4_4_ * auVar98._4_4_;
  auVar234._8_4_ = auVar95._8_4_ * auVar98._8_4_;
  auVar234._12_4_ = auVar95._12_4_ * auVar98._12_4_;
  auVar98 = vfmadd231ps_avx512vl(auVar91,auVar3,auVar90);
  auVar95 = vfmadd231ps_avx512vl(auVar282,auVar3,auVar93);
  auVar103 = vfmadd231ps_fma(auVar234,auVar3,auVar104);
  auVar89 = vfmadd231ps_avx512vl(auVar98,auVar295,auVar89);
  auVar90 = vfmadd231ps_avx512vl(auVar95,auVar295,auVar92);
  auVar88 = vfmadd231ps_fma(auVar103,auVar295,auVar102);
  auVar290._8_4_ = 0x7fffffff;
  auVar290._0_8_ = 0x7fffffff7fffffff;
  auVar290._12_4_ = 0x7fffffff;
  auVar284._8_4_ = 0x219392ef;
  auVar284._0_8_ = 0x219392ef219392ef;
  auVar284._12_4_ = 0x219392ef;
  auVar103 = vandps_avx(auVar290,auVar96);
  uVar77 = vcmpps_avx512vl(auVar103,auVar284,1);
  bVar82 = (bool)((byte)uVar77 & 1);
  auVar99._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar96._0_4_;
  bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar96._4_4_;
  bVar82 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar96._8_4_;
  bVar82 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar96._12_4_;
  auVar103 = vandps_avx(auVar290,auVar97);
  uVar77 = vcmpps_avx512vl(auVar103,auVar284,1);
  bVar82 = (bool)((byte)uVar77 & 1);
  auVar100._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar97._0_4_;
  bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar97._4_4_;
  bVar82 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar97._8_4_;
  bVar82 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar97._12_4_;
  auVar103 = vandps_avx(auVar290,auVar94);
  uVar77 = vcmpps_avx512vl(auVar103,auVar284,1);
  bVar82 = (bool)((byte)uVar77 & 1);
  auVar101._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar94._0_4_;
  bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar94._4_4_;
  bVar82 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar94._8_4_;
  bVar82 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar94._12_4_;
  auVar102 = vrcp14ps_avx512vl(auVar99);
  auVar288._8_4_ = 0x3f800000;
  auVar288._0_8_ = 0x3f8000003f800000;
  auVar288._12_4_ = 0x3f800000;
  auVar103 = vfnmadd213ps_fma(auVar99,auVar102,auVar288);
  auVar104 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar103 = vfnmadd213ps_fma(auVar100,auVar102,auVar288);
  auVar98 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar101);
  auVar103 = vfnmadd213ps_fma(auVar101,auVar102,auVar288);
  auVar3 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
  auVar257._4_4_ = fVar273;
  auVar257._0_4_ = fVar273;
  auVar257._8_4_ = fVar273;
  auVar257._12_4_ = fVar273;
  auVar103 = vcvtdq2ps_avx(auVar107);
  auVar102 = vcvtdq2ps_avx(auVar283);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar106 = vfmadd213ps_fma(auVar102,auVar257,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar171);
  auVar102 = vcvtdq2ps_avx512vl(auVar86);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar105 = vfmadd213ps_fma(auVar102,auVar257,auVar103);
  auVar91 = vcvtdq2ps_avx512vl(auVar87);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 0x16 + 6);
  auVar103 = vpmovsxwd_avx(auVar95);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vsubps_avx(auVar103,auVar91);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 6);
  auVar103 = vpmovsxwd_avx(auVar94);
  auVar95 = vfmadd213ps_fma(auVar102,auVar257,auVar91);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar102 = vpmovsxwd_avx(auVar91);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar94 = vfmadd213ps_fma(auVar102,auVar257,auVar103);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar103 = vpmovsxwd_avx(auVar92);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar83 * 0x21 + 6);
  auVar102 = vpmovsxwd_avx(auVar93);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar91 = vfmadd213ps_fma(auVar102,auVar257,auVar103);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar83 * 0x1f + 6);
  auVar103 = vpmovsxwd_avx(auVar96);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar102 = vpmovsxwd_avx(auVar97);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar102 = vfmadd213ps_fma(auVar102,auVar257,auVar103);
  auVar103 = vsubps_avx512vl(auVar106,auVar89);
  auVar258._0_4_ = auVar104._0_4_ * auVar103._0_4_;
  auVar258._4_4_ = auVar104._4_4_ * auVar103._4_4_;
  auVar258._8_4_ = auVar104._8_4_ * auVar103._8_4_;
  auVar258._12_4_ = auVar104._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx512vl(auVar105,auVar89);
  auVar87._0_4_ = auVar104._0_4_ * auVar103._0_4_;
  auVar87._4_4_ = auVar104._4_4_ * auVar103._4_4_;
  auVar87._8_4_ = auVar104._8_4_ * auVar103._8_4_;
  auVar87._12_4_ = auVar104._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar95,auVar90);
  auVar89._0_4_ = auVar98._0_4_ * auVar103._0_4_;
  auVar89._4_4_ = auVar98._4_4_ * auVar103._4_4_;
  auVar89._8_4_ = auVar98._8_4_ * auVar103._8_4_;
  auVar89._12_4_ = auVar98._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar94,auVar90);
  auVar86._0_4_ = auVar98._0_4_ * auVar103._0_4_;
  auVar86._4_4_ = auVar98._4_4_ * auVar103._4_4_;
  auVar86._8_4_ = auVar98._8_4_ * auVar103._8_4_;
  auVar86._12_4_ = auVar98._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar91,auVar88);
  auVar90._0_4_ = auVar3._0_4_ * auVar103._0_4_;
  auVar90._4_4_ = auVar3._4_4_ * auVar103._4_4_;
  auVar90._8_4_ = auVar3._8_4_ * auVar103._8_4_;
  auVar90._12_4_ = auVar3._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar102,auVar88);
  auVar171._0_4_ = auVar3._0_4_ * auVar103._0_4_;
  auVar171._4_4_ = auVar3._4_4_ * auVar103._4_4_;
  auVar171._8_4_ = auVar3._8_4_ * auVar103._8_4_;
  auVar171._12_4_ = auVar3._12_4_ * auVar103._12_4_;
  auVar103 = vpminsd_avx(auVar258,auVar87);
  auVar102 = vpminsd_avx(auVar89,auVar86);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102 = vpminsd_avx(auVar90,auVar171);
  uVar196 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar106._4_4_ = uVar196;
  auVar106._0_4_ = uVar196;
  auVar106._8_4_ = uVar196;
  auVar106._12_4_ = uVar196;
  auVar102 = vmaxps_avx512vl(auVar102,auVar106);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar105._8_4_ = 0x3f7ffffa;
  auVar105._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar105._12_4_ = 0x3f7ffffa;
  local_6e0 = vmulps_avx512vl(auVar103,auVar105);
  auVar103 = vpmaxsd_avx(auVar258,auVar87);
  auVar102 = vpmaxsd_avx(auVar89,auVar86);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar102 = vpmaxsd_avx(auVar90,auVar171);
  uVar196 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar107._4_4_ = uVar196;
  auVar107._0_4_ = uVar196;
  auVar107._8_4_ = uVar196;
  auVar107._12_4_ = uVar196;
  auVar102 = vminps_avx512vl(auVar102,auVar107);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar283._8_4_ = 0x3f800003;
  auVar283._0_8_ = 0x3f8000033f800003;
  auVar283._12_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar283);
  uVar26 = vcmpps_avx512vl(local_6e0,auVar103,2);
  uVar29 = vpcmpgtd_avx512vl(auVar85,_DAT_01f4ad30);
  local_8e8 = (ulong)((byte)uVar26 & 0xf & (byte)uVar29);
  local_a50 = (undefined1 (*) [32])local_240;
  auVar189 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar189);
  local_8f0 = prim;
LAB_018dacf3:
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  auVar189 = ZEXT3264(auVar123);
  if (local_8e8 == 0) {
    return;
  }
  lVar76 = 0;
  for (uVar77 = local_8e8; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    lVar76 = lVar76 + 1;
  }
  uVar4 = *(uint *)(local_8f0 + 2);
  local_a48 = (ulong)*(uint *)(local_8f0 + lVar76 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
  uVar77 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_a48 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar2 = (pGVar5->time_range).lower;
  fVar2 = pGVar5->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x1c0) - fVar2) / ((pGVar5->time_range).upper - fVar2));
  auVar103 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  auVar103 = vminss_avx(auVar103,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar103 = vmaxss_avx(ZEXT816(0) << 0x20,auVar103);
  fVar2 = fVar2 - auVar103._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar81 = (long)(int)auVar103._0_4_ * 0x38;
  lVar76 = *(long *)(_Var6 + 0x10 + lVar81);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar81);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar81);
  pfVar1 = (float *)(lVar7 + uVar77 * lVar8);
  auVar216._0_4_ = fVar2 * *pfVar1;
  auVar216._4_4_ = fVar2 * pfVar1[1];
  auVar216._8_4_ = fVar2 * pfVar1[2];
  auVar216._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar77 + 1) * lVar8);
  auVar235._0_4_ = fVar2 * *pfVar1;
  auVar235._4_4_ = fVar2 * pfVar1[1];
  auVar235._8_4_ = fVar2 * pfVar1[2];
  auVar235._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar77 + 2) * lVar8);
  auVar254._0_4_ = fVar2 * *pfVar1;
  auVar254._4_4_ = fVar2 * pfVar1[1];
  auVar254._8_4_ = fVar2 * pfVar1[2];
  auVar254._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar77 + 3));
  auVar198._0_4_ = fVar2 * *pfVar1;
  auVar198._4_4_ = fVar2 * pfVar1[1];
  auVar198._8_4_ = fVar2 * pfVar1[2];
  auVar198._12_4_ = fVar2 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar81);
  fVar2 = 1.0 - fVar2;
  auVar172._4_4_ = fVar2;
  auVar172._0_4_ = fVar2;
  auVar172._8_4_ = fVar2;
  auVar172._12_4_ = fVar2;
  auVar104 = vfmadd231ps_fma(auVar216,auVar172,*(undefined1 (*) [16])(lVar7 + lVar76 * uVar77));
  auVar98 = vfmadd231ps_fma(auVar235,auVar172,*(undefined1 (*) [16])(lVar7 + lVar76 * (uVar77 + 1)))
  ;
  auVar3 = vfmadd231ps_fma(auVar254,auVar172,*(undefined1 (*) [16])(lVar7 + lVar76 * (uVar77 + 2)));
  auVar95 = vfmadd231ps_fma(auVar198,auVar172,*(undefined1 (*) [16])(lVar7 + lVar76 * (uVar77 + 3)))
  ;
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar102 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar196 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar296._4_4_ = uVar196;
  auVar296._0_4_ = uVar196;
  auVar296._8_4_ = uVar196;
  auVar296._12_4_ = uVar196;
  local_820._16_4_ = uVar196;
  local_820._0_16_ = auVar296;
  local_820._20_4_ = uVar196;
  local_820._24_4_ = uVar196;
  local_820._28_4_ = uVar196;
  uVar196 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar298._4_4_ = uVar196;
  auVar298._0_4_ = uVar196;
  auVar298._8_4_ = uVar196;
  auVar298._12_4_ = uVar196;
  local_6a0._16_4_ = uVar196;
  local_6a0._0_16_ = auVar298;
  local_6a0._20_4_ = uVar196;
  local_6a0._24_4_ = uVar196;
  local_6a0._28_4_ = uVar196;
  auVar103 = vunpcklps_avx(auVar296,auVar298);
  local_840 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar92 = local_840._0_16_;
  local_a10 = vinsertps_avx512f(auVar103,auVar92,0x28);
  auVar286 = ZEXT1664(local_a10);
  auVar259._0_4_ = auVar104._0_4_ + auVar98._0_4_ + auVar3._0_4_ + auVar95._0_4_;
  auVar259._4_4_ = auVar104._4_4_ + auVar98._4_4_ + auVar3._4_4_ + auVar95._4_4_;
  auVar259._8_4_ = auVar104._8_4_ + auVar98._8_4_ + auVar3._8_4_ + auVar95._8_4_;
  auVar259._12_4_ = auVar104._12_4_ + auVar98._12_4_ + auVar3._12_4_ + auVar95._12_4_;
  auVar85._8_4_ = 0x3e800000;
  auVar85._0_8_ = 0x3e8000003e800000;
  auVar85._12_4_ = 0x3e800000;
  auVar103 = vmulps_avx512vl(auVar259,auVar85);
  auVar103 = vsubps_avx(auVar103,auVar102);
  auVar103 = vdpps_avx(auVar103,local_a10,0x7f);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar289 = ZEXT1664(local_a20);
  fVar2 = *(float *)(ray + k * 4 + 0xc0);
  auVar294 = ZEXT464((uint)fVar2);
  auVar266._4_12_ = ZEXT812(0) << 0x20;
  auVar266._0_4_ = local_a20._0_4_;
  auVar91 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar266);
  auVar94 = vfnmadd213ss_fma(auVar91,local_a20,ZEXT416(0x40000000));
  local_620 = auVar103._0_4_ * auVar91._0_4_ * auVar94._0_4_;
  auVar264 = ZEXT3264(_DAT_01f7b040);
  auVar268._4_4_ = local_620;
  auVar268._0_4_ = local_620;
  auVar268._8_4_ = local_620;
  auVar268._12_4_ = local_620;
  fStack_7d0 = local_620;
  _local_7e0 = auVar268;
  fStack_7cc = local_620;
  fStack_7c8 = local_620;
  fStack_7c4 = local_620;
  auVar103 = vfmadd231ps_fma(auVar102,local_a10,auVar268);
  auVar103 = vblendps_avx(auVar103,ZEXT816(0) << 0x40,8);
  auVar102 = vsubps_avx(auVar104,auVar103);
  auVar272 = ZEXT1664(auVar102);
  auVar104 = vsubps_avx(auVar3,auVar103);
  auVar98 = vsubps_avx(auVar98,auVar103);
  auVar103 = vsubps_avx(auVar95,auVar103);
  auVar277 = ZEXT1664(auVar103);
  auVar108 = vbroadcastss_avx512vl(auVar102);
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  local_9a0 = ZEXT1632(auVar102);
  auVar109 = vpermps_avx512vl(auVar120,local_9a0);
  auVar302 = ZEXT3264(auVar109);
  auVar121._8_4_ = 2;
  auVar121._0_8_ = 0x200000002;
  auVar121._12_4_ = 2;
  auVar121._16_4_ = 2;
  auVar121._20_4_ = 2;
  auVar121._24_4_ = 2;
  auVar121._28_4_ = 2;
  auVar110 = vpermps_avx512vl(auVar121,local_9a0);
  auVar303 = ZEXT3264(auVar110);
  auVar124._8_4_ = 3;
  auVar124._0_8_ = 0x300000003;
  auVar124._12_4_ = 3;
  auVar124._16_4_ = 3;
  auVar124._20_4_ = 3;
  auVar124._24_4_ = 3;
  auVar124._28_4_ = 3;
  auVar111 = vpermps_avx512vl(auVar124,local_9a0);
  auVar112 = vbroadcastss_avx512vl(auVar98);
  local_9e0 = ZEXT1632(auVar98);
  auVar113 = vpermps_avx512vl(auVar120,local_9e0);
  auVar114 = vpermps_avx512vl(auVar121,local_9e0);
  auVar115 = vpermps_avx512vl(auVar124,local_9e0);
  auVar116 = vbroadcastss_avx512vl(auVar104);
  local_9c0 = ZEXT1632(auVar104);
  auVar117 = vpermps_avx512vl(auVar120,local_9c0);
  auVar118 = vpermps_avx512vl(auVar121,local_9c0);
  auVar119 = vpermps_avx512vl(auVar124,local_9c0);
  local_5a0 = vbroadcastss_avx512vl(auVar103);
  _local_a00 = ZEXT1632(auVar103);
  local_5c0 = vpermps_avx2(auVar120,_local_a00);
  local_5e0 = vpermps_avx512vl(auVar121,_local_a00);
  local_600 = vpermps_avx2(auVar124,_local_a00);
  auVar103 = vmulss_avx512f(auVar92,auVar92);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_6a0,local_6a0);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_820,local_820);
  local_560._0_4_ = auVar103._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  local_580 = vandps_avx(auVar123,local_560);
  local_950 = ZEXT416((uint)local_620);
  local_620 = fVar2 - local_620;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar162 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar162);
  uVar77 = 0;
  iVar80 = 1;
  auVar162 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar162);
  auVar103 = vsqrtss_avx(local_a20,local_a20);
  auVar102 = vsqrtss_avx(local_a20,local_a20);
  local_6d0 = ZEXT816(0x3f80000000000000);
  do {
    auVar104 = vmovshdup_avx(local_6d0);
    auVar104 = vsubps_avx(auVar104,local_6d0);
    auVar173._0_4_ = auVar104._0_4_;
    fVar25 = auVar173._0_4_ * 0.04761905;
    uVar196 = local_6d0._0_4_;
    local_a80._4_4_ = uVar196;
    local_a80._0_4_ = uVar196;
    local_a80._8_4_ = uVar196;
    local_a80._12_4_ = uVar196;
    local_a80._16_4_ = uVar196;
    local_a80._20_4_ = uVar196;
    local_a80._24_4_ = uVar196;
    local_a80._28_4_ = uVar196;
    auVar173._4_4_ = auVar173._0_4_;
    auVar173._8_4_ = auVar173._0_4_;
    auVar173._12_4_ = auVar173._0_4_;
    auVar180._16_4_ = auVar173._0_4_;
    auVar180._0_16_ = auVar173;
    auVar180._20_4_ = auVar173._0_4_;
    auVar180._24_4_ = auVar173._0_4_;
    auVar180._28_4_ = auVar173._0_4_;
    auVar104 = vfmadd231ps_fma(local_a80,auVar180,auVar264._0_32_);
    auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar121 = vsubps_avx512vl(auVar120,ZEXT1632(auVar104));
    fVar273 = auVar121._0_4_;
    fVar279 = auVar121._4_4_;
    fVar251 = auVar121._8_4_;
    fVar253 = auVar121._12_4_;
    fVar301 = auVar121._16_4_;
    fVar215 = auVar121._20_4_;
    fVar24 = auVar121._24_4_;
    fVar170 = fVar273 * fVar273 * fVar273;
    fVar190 = fVar279 * fVar279 * fVar279;
    auVar125._4_4_ = fVar190;
    auVar125._0_4_ = fVar170;
    fVar191 = fVar251 * fVar251 * fVar251;
    auVar125._8_4_ = fVar191;
    fVar192 = fVar253 * fVar253 * fVar253;
    auVar125._12_4_ = fVar192;
    fVar193 = fVar301 * fVar301 * fVar301;
    auVar125._16_4_ = fVar193;
    fVar194 = fVar215 * fVar215 * fVar215;
    auVar125._20_4_ = fVar194;
    fVar195 = fVar24 * fVar24 * fVar24;
    auVar125._24_4_ = fVar195;
    auVar125._28_4_ = auVar173._0_4_;
    auVar122 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar123 = vmulps_avx512vl(auVar125,auVar122);
    fVar278 = auVar104._0_4_;
    fVar280 = auVar104._4_4_;
    fVar252 = auVar104._8_4_;
    fVar300 = auVar104._12_4_;
    fVar214 = fVar278 * fVar278 * fVar278;
    fVar231 = fVar280 * fVar280 * fVar280;
    fVar232 = fVar252 * fVar252 * fVar252;
    fVar233 = fVar300 * fVar300 * fVar300;
    auVar162._0_4_ = fVar278 * fVar273;
    auVar162._4_4_ = fVar280 * fVar279;
    auVar162._8_4_ = fVar252 * fVar251;
    auVar162._12_4_ = fVar300 * fVar253;
    auVar162._16_4_ = fVar301 * 0.0;
    auVar162._20_4_ = fVar215 * 0.0;
    auVar162._28_36_ = auVar189._28_36_;
    auVar162._24_4_ = fVar24 * 0.0;
    auVar124 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar233,CONCAT48(fVar232,CONCAT44(fVar231,fVar214)
                                                                  ))),auVar122);
    fVar287 = auVar124._28_4_ + auVar173._0_4_;
    fVar265 = fVar287 + auVar289._28_4_ + auVar264._28_4_;
    auVar130._4_4_ = fVar190 * 0.16666667;
    auVar130._0_4_ = fVar170 * 0.16666667;
    auVar130._8_4_ = fVar191 * 0.16666667;
    auVar130._12_4_ = fVar192 * 0.16666667;
    auVar130._16_4_ = fVar193 * 0.16666667;
    auVar130._20_4_ = fVar194 * 0.16666667;
    auVar130._24_4_ = fVar195 * 0.16666667;
    auVar130._28_4_ = fVar287;
    auVar127._4_4_ =
         (auVar162._4_4_ * fVar279 * 12.0 + auVar162._4_4_ * fVar280 * 6.0 +
         fVar231 + auVar123._4_4_) * 0.16666667;
    auVar127._0_4_ =
         (auVar162._0_4_ * fVar273 * 12.0 + auVar162._0_4_ * fVar278 * 6.0 +
         fVar214 + auVar123._0_4_) * 0.16666667;
    auVar127._8_4_ =
         (auVar162._8_4_ * fVar251 * 12.0 + auVar162._8_4_ * fVar252 * 6.0 +
         fVar232 + auVar123._8_4_) * 0.16666667;
    auVar127._12_4_ =
         (auVar162._12_4_ * fVar253 * 12.0 + auVar162._12_4_ * fVar300 * 6.0 +
         fVar233 + auVar123._12_4_) * 0.16666667;
    auVar127._16_4_ =
         (auVar162._16_4_ * fVar301 * 12.0 + auVar162._16_4_ * 0.0 * 6.0 + auVar123._16_4_ + 0.0) *
         0.16666667;
    auVar127._20_4_ =
         (auVar162._20_4_ * fVar215 * 12.0 + auVar162._20_4_ * 0.0 * 6.0 + auVar123._20_4_ + 0.0) *
         0.16666667;
    auVar127._24_4_ =
         (auVar162._24_4_ * fVar24 * 12.0 + auVar162._24_4_ * 0.0 * 6.0 + auVar123._24_4_ + 0.0) *
         0.16666667;
    auVar127._28_4_ = auVar289._28_4_;
    auVar128._4_4_ =
         (auVar124._4_4_ + fVar190 +
         auVar162._4_4_ * fVar280 * 12.0 + auVar162._4_4_ * fVar279 * 6.0) * 0.16666667;
    auVar128._0_4_ =
         (auVar124._0_4_ + fVar170 +
         auVar162._0_4_ * fVar278 * 12.0 + auVar162._0_4_ * fVar273 * 6.0) * 0.16666667;
    auVar128._8_4_ =
         (auVar124._8_4_ + fVar191 +
         auVar162._8_4_ * fVar252 * 12.0 + auVar162._8_4_ * fVar251 * 6.0) * 0.16666667;
    auVar128._12_4_ =
         (auVar124._12_4_ + fVar192 +
         auVar162._12_4_ * fVar300 * 12.0 + auVar162._12_4_ * fVar253 * 6.0) * 0.16666667;
    auVar128._16_4_ =
         (auVar124._16_4_ + fVar193 + auVar162._16_4_ * 0.0 * 12.0 + auVar162._16_4_ * fVar301 * 6.0
         ) * 0.16666667;
    auVar128._20_4_ =
         (auVar124._20_4_ + fVar194 + auVar162._20_4_ * 0.0 * 12.0 + auVar162._20_4_ * fVar215 * 6.0
         ) * 0.16666667;
    auVar128._24_4_ =
         (auVar124._24_4_ + fVar195 + auVar162._24_4_ * 0.0 * 12.0 + auVar162._24_4_ * fVar24 * 6.0)
         * 0.16666667;
    auVar128._28_4_ = auVar294._28_4_;
    fVar214 = fVar214 * 0.16666667;
    fVar231 = fVar231 * 0.16666667;
    fVar232 = fVar232 * 0.16666667;
    fVar233 = fVar233 * 0.16666667;
    auVar129._28_4_ = fVar265;
    auVar129._0_28_ = ZEXT1628(CONCAT412(fVar233,CONCAT48(fVar232,CONCAT44(fVar231,fVar214))));
    auVar124 = vmulps_avx512vl(local_5a0,auVar129);
    auVar132._4_4_ = local_5c0._4_4_ * fVar231;
    auVar132._0_4_ = local_5c0._0_4_ * fVar214;
    auVar132._8_4_ = local_5c0._8_4_ * fVar232;
    auVar132._12_4_ = local_5c0._12_4_ * fVar233;
    auVar132._16_4_ = local_5c0._16_4_ * 0.0;
    auVar132._20_4_ = local_5c0._20_4_ * 0.0;
    auVar132._24_4_ = local_5c0._24_4_ * 0.0;
    auVar132._28_4_ = auVar286._28_4_ + auVar294._28_4_ + auVar123._28_4_ + 0.0;
    auVar123 = vmulps_avx512vl(local_5e0,auVar129);
    auVar133._4_4_ = local_600._4_4_ * fVar231;
    auVar133._0_4_ = local_600._0_4_ * fVar214;
    auVar133._8_4_ = local_600._8_4_ * fVar232;
    auVar133._12_4_ = local_600._12_4_ * fVar233;
    auVar133._16_4_ = local_600._16_4_ * 0.0;
    auVar133._20_4_ = local_600._20_4_ * 0.0;
    auVar133._24_4_ = local_600._24_4_ * 0.0;
    auVar133._28_4_ = fVar265;
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar128,auVar116);
    auVar125 = vfmadd231ps_avx512vl(auVar132,auVar128,auVar117);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar128,auVar118);
    auVar126 = vfmadd231ps_avx512vl(auVar133,auVar119,auVar128);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar127,auVar112);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar127,auVar113);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar127,auVar114);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar115,auVar127);
    auVar127 = vfmadd231ps_avx512vl(auVar124,auVar130,auVar108);
    auVar128 = vfmadd231ps_avx512vl(auVar125,auVar130,auVar302._0_32_);
    auVar129 = vfmadd231ps_avx512vl(auVar123,auVar130,auVar303._0_32_);
    auVar124 = vfmadd231ps_avx512vl(auVar126,auVar111,auVar130);
    auVar130 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar125 = vxorps_avx512vl(auVar121,auVar130);
    auVar126 = vxorps_avx512vl(ZEXT1632(auVar104),auVar130);
    auVar145._0_4_ = auVar126._0_4_ * fVar278;
    auVar145._4_4_ = auVar126._4_4_ * fVar280;
    auVar145._8_4_ = auVar126._8_4_ * fVar252;
    auVar145._12_4_ = auVar126._12_4_ * fVar300;
    auVar145._16_4_ = auVar126._16_4_ * 0.0;
    auVar145._20_4_ = auVar126._20_4_ * 0.0;
    auVar145._24_4_ = auVar126._24_4_ * 0.0;
    auVar145._28_4_ = 0;
    auVar131 = vmulps_avx512vl(auVar162._0_32_,auVar122);
    auVar123 = vsubps_avx(auVar145,auVar131);
    auVar134._4_4_ = auVar125._4_4_ * fVar279 * 0.5;
    auVar134._0_4_ = auVar125._0_4_ * fVar273 * 0.5;
    auVar134._8_4_ = auVar125._8_4_ * fVar251 * 0.5;
    auVar134._12_4_ = auVar125._12_4_ * fVar253 * 0.5;
    auVar134._16_4_ = auVar125._16_4_ * fVar301 * 0.5;
    auVar134._20_4_ = auVar125._20_4_ * fVar215 * 0.5;
    auVar134._24_4_ = auVar125._24_4_ * fVar24 * 0.5;
    auVar134._28_4_ = auVar121._28_4_;
    auVar135._4_4_ = auVar123._4_4_ * 0.5;
    auVar135._0_4_ = auVar123._0_4_ * 0.5;
    auVar135._8_4_ = auVar123._8_4_ * 0.5;
    auVar135._12_4_ = auVar123._12_4_ * 0.5;
    auVar135._16_4_ = auVar123._16_4_ * 0.5;
    auVar135._20_4_ = auVar123._20_4_ * 0.5;
    auVar135._24_4_ = auVar123._24_4_ * 0.5;
    auVar135._28_4_ = auVar123._28_4_;
    auVar136._4_4_ = (auVar131._4_4_ + fVar279 * fVar279) * 0.5;
    auVar136._0_4_ = (auVar131._0_4_ + fVar273 * fVar273) * 0.5;
    auVar136._8_4_ = (auVar131._8_4_ + fVar251 * fVar251) * 0.5;
    auVar136._12_4_ = (auVar131._12_4_ + fVar253 * fVar253) * 0.5;
    auVar136._16_4_ = (auVar131._16_4_ + fVar301 * fVar301) * 0.5;
    auVar136._20_4_ = (auVar131._20_4_ + fVar215 * fVar215) * 0.5;
    auVar136._24_4_ = (auVar131._24_4_ + fVar24 * fVar24) * 0.5;
    auVar136._28_4_ = auVar131._28_4_ + auVar272._28_4_;
    fVar273 = fVar278 * fVar278 * 0.5;
    fVar278 = fVar280 * fVar280 * 0.5;
    fVar279 = fVar252 * fVar252 * 0.5;
    fVar280 = fVar300 * fVar300 * 0.5;
    auVar137._28_4_ = auVar277._28_4_;
    auVar137._0_28_ = ZEXT1628(CONCAT412(fVar280,CONCAT48(fVar279,CONCAT44(fVar278,fVar273))));
    auVar123 = vmulps_avx512vl(local_5a0,auVar137);
    auVar141._4_4_ = local_5c0._4_4_ * fVar278;
    auVar141._0_4_ = local_5c0._0_4_ * fVar273;
    auVar141._8_4_ = local_5c0._8_4_ * fVar279;
    auVar141._12_4_ = local_5c0._12_4_ * fVar280;
    auVar141._16_4_ = local_5c0._16_4_ * 0.0;
    auVar141._20_4_ = local_5c0._20_4_ * 0.0;
    auVar141._24_4_ = local_5c0._24_4_ * 0.0;
    auVar141._28_4_ = auVar126._28_4_;
    auVar121 = vmulps_avx512vl(local_5e0,auVar137);
    auVar142._4_4_ = fVar278 * local_600._4_4_;
    auVar142._0_4_ = fVar273 * local_600._0_4_;
    auVar142._8_4_ = fVar279 * local_600._8_4_;
    auVar142._12_4_ = fVar280 * local_600._12_4_;
    auVar142._16_4_ = local_600._16_4_ * 0.0;
    auVar142._20_4_ = local_600._20_4_ * 0.0;
    auVar142._24_4_ = local_600._24_4_ * 0.0;
    auVar142._28_4_ = auVar277._28_4_;
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar136,auVar116);
    auVar125 = vfmadd231ps_avx512vl(auVar141,auVar136,auVar117);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar136,auVar118);
    auVar104 = vfmadd231ps_fma(auVar142,auVar119,auVar136);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar135,auVar112);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar135,auVar113);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar135,auVar114);
    auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar115,auVar135);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar134,auVar108);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar134,auVar302._0_32_);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar134,auVar303._0_32_);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar111,auVar134);
    auVar149._4_4_ = auVar123._4_4_ * fVar25;
    auVar149._0_4_ = auVar123._0_4_ * fVar25;
    auVar149._8_4_ = auVar123._8_4_ * fVar25;
    auVar149._12_4_ = auVar123._12_4_ * fVar25;
    auVar149._16_4_ = auVar123._16_4_ * fVar25;
    auVar149._20_4_ = auVar123._20_4_ * fVar25;
    auVar149._24_4_ = auVar123._24_4_ * fVar25;
    auVar149._28_4_ = auVar119._28_4_;
    auVar294 = ZEXT3264(auVar149);
    auVar150._4_4_ = auVar125._4_4_ * fVar25;
    auVar150._0_4_ = auVar125._0_4_ * fVar25;
    auVar150._8_4_ = auVar125._8_4_ * fVar25;
    auVar150._12_4_ = auVar125._12_4_ * fVar25;
    auVar150._16_4_ = auVar125._16_4_ * fVar25;
    auVar150._20_4_ = auVar125._20_4_ * fVar25;
    auVar150._24_4_ = auVar125._24_4_ * fVar25;
    auVar150._28_4_ = 0x3e2aaaab;
    auVar151._4_4_ = auVar121._4_4_ * fVar25;
    auVar151._0_4_ = auVar121._0_4_ * fVar25;
    auVar151._8_4_ = auVar121._8_4_ * fVar25;
    auVar151._12_4_ = auVar121._12_4_ * fVar25;
    auVar151._16_4_ = auVar121._16_4_ * fVar25;
    auVar151._20_4_ = auVar121._20_4_ * fVar25;
    auVar151._24_4_ = auVar121._24_4_ * fVar25;
    auVar151._28_4_ = 0x40c00000;
    fVar273 = auVar126._0_4_ * fVar25;
    fVar278 = auVar126._4_4_ * fVar25;
    auVar143._4_4_ = fVar278;
    auVar143._0_4_ = fVar273;
    fVar279 = auVar126._8_4_ * fVar25;
    auVar143._8_4_ = fVar279;
    fVar280 = auVar126._12_4_ * fVar25;
    auVar143._12_4_ = fVar280;
    fVar251 = auVar126._16_4_ * fVar25;
    auVar143._16_4_ = fVar251;
    fVar252 = auVar126._20_4_ * fVar25;
    auVar143._20_4_ = fVar252;
    fVar253 = auVar126._24_4_ * fVar25;
    auVar143._24_4_ = fVar253;
    auVar143._28_4_ = fVar25;
    auVar104 = vxorps_avx512vl(auVar120._0_16_,auVar120._0_16_);
    auVar132 = vpermt2ps_avx512vl(auVar127,_DAT_01fb9fc0,ZEXT1632(auVar104));
    auVar189 = ZEXT3264(auVar132);
    auVar133 = vpermt2ps_avx512vl(auVar128,_DAT_01fb9fc0,ZEXT1632(auVar104));
    auVar286 = ZEXT3264(auVar133);
    auVar121 = ZEXT1632(auVar104);
    auVar134 = vpermt2ps_avx512vl(auVar129,_DAT_01fb9fc0,auVar121);
    auVar289 = ZEXT3264(auVar134);
    auVar146._0_4_ = fVar273 + auVar124._0_4_;
    auVar146._4_4_ = fVar278 + auVar124._4_4_;
    auVar146._8_4_ = fVar279 + auVar124._8_4_;
    auVar146._12_4_ = fVar280 + auVar124._12_4_;
    auVar146._16_4_ = fVar251 + auVar124._16_4_;
    auVar146._20_4_ = fVar252 + auVar124._20_4_;
    auVar146._24_4_ = fVar253 + auVar124._24_4_;
    auVar146._28_4_ = fVar25 + auVar124._28_4_;
    auVar123 = vmaxps_avx(auVar124,auVar146);
    auVar120 = vminps_avx(auVar124,auVar146);
    auVar131 = vpermt2ps_avx512vl(auVar124,_DAT_01fb9fc0,auVar121);
    auVar135 = vpermt2ps_avx512vl(auVar149,_DAT_01fb9fc0,auVar121);
    auVar136 = vpermt2ps_avx512vl(auVar150,_DAT_01fb9fc0,auVar121);
    auVar304 = ZEXT1632(auVar104);
    auVar137 = vpermt2ps_avx512vl(auVar151,_DAT_01fb9fc0,auVar304);
    auVar121 = vpermt2ps_avx512vl(auVar143,_DAT_01fb9fc0,auVar304);
    auVar138 = vsubps_avx512vl(auVar131,auVar121);
    auVar121 = vsubps_avx(auVar132,auVar127);
    auVar277 = ZEXT3264(auVar121);
    auVar124 = vsubps_avx(auVar133,auVar128);
    auVar272 = ZEXT3264(auVar124);
    auVar125 = vsubps_avx(auVar134,auVar129);
    auVar126 = vmulps_avx512vl(auVar124,auVar151);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar150,auVar125);
    auVar139 = vmulps_avx512vl(auVar125,auVar149);
    auVar139 = vfmsub231ps_avx512vl(auVar139,auVar151,auVar121);
    auVar140 = vmulps_avx512vl(auVar121,auVar150);
    auVar140 = vfmsub231ps_avx512vl(auVar140,auVar149,auVar124);
    auVar140 = vmulps_avx512vl(auVar140,auVar140);
    auVar139 = vfmadd231ps_avx512vl(auVar140,auVar139,auVar139);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar126,auVar126);
    auVar126 = vmulps_avx512vl(auVar125,auVar125);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar124,auVar124);
    auVar140 = vfmadd231ps_avx512vl(auVar126,auVar121,auVar121);
    auVar141 = vrcp14ps_avx512vl(auVar140);
    auVar126._8_4_ = 0x3f800000;
    auVar126._0_8_ = 0x3f8000003f800000;
    auVar126._12_4_ = 0x3f800000;
    auVar126._16_4_ = 0x3f800000;
    auVar126._20_4_ = 0x3f800000;
    auVar126._24_4_ = 0x3f800000;
    auVar126._28_4_ = 0x3f800000;
    auVar126 = vfnmadd213ps_avx512vl(auVar141,auVar140,auVar126);
    auVar126 = vfmadd132ps_avx512vl(auVar126,auVar141,auVar141);
    auVar139 = vmulps_avx512vl(auVar139,auVar126);
    auVar141 = vmulps_avx512vl(auVar124,auVar137);
    auVar141 = vfmsub231ps_avx512vl(auVar141,auVar136,auVar125);
    auVar142 = vmulps_avx512vl(auVar125,auVar135);
    auVar142 = vfmsub231ps_avx512vl(auVar142,auVar137,auVar121);
    auVar143 = vmulps_avx512vl(auVar121,auVar136);
    auVar143 = vfmsub231ps_avx512vl(auVar143,auVar135,auVar124);
    auVar143 = vmulps_avx512vl(auVar143,auVar143);
    auVar142 = vfmadd231ps_avx512vl(auVar143,auVar142,auVar142);
    auVar141 = vfmadd231ps_avx512vl(auVar142,auVar141,auVar141);
    auVar126 = vmulps_avx512vl(auVar141,auVar126);
    auVar126 = vmaxps_avx512vl(auVar139,auVar126);
    auVar126 = vsqrtps_avx512vl(auVar126);
    auVar139 = vmaxps_avx512vl(auVar138,auVar131);
    auVar123 = vmaxps_avx512vl(auVar123,auVar139);
    auVar141 = vaddps_avx512vl(auVar126,auVar123);
    auVar123 = vminps_avx512vl(auVar138,auVar131);
    auVar123 = vminps_avx(auVar120,auVar123);
    auVar123 = vsubps_avx512vl(auVar123,auVar126);
    auVar131._8_4_ = 0x3f800002;
    auVar131._0_8_ = 0x3f8000023f800002;
    auVar131._12_4_ = 0x3f800002;
    auVar131._16_4_ = 0x3f800002;
    auVar131._20_4_ = 0x3f800002;
    auVar131._24_4_ = 0x3f800002;
    auVar131._28_4_ = 0x3f800002;
    auVar120 = vmulps_avx512vl(auVar141,auVar131);
    auVar138._8_4_ = 0x3f7ffffc;
    auVar138._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar138._12_4_ = 0x3f7ffffc;
    auVar138._16_4_ = 0x3f7ffffc;
    auVar138._20_4_ = 0x3f7ffffc;
    auVar138._24_4_ = 0x3f7ffffc;
    auVar138._28_4_ = 0x3f7ffffc;
    auVar123 = vmulps_avx512vl(auVar123,auVar138);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar126 = vrsqrt14ps_avx512vl(auVar140);
    auVar139._8_4_ = 0xbf000000;
    auVar139._0_8_ = 0xbf000000bf000000;
    auVar139._12_4_ = 0xbf000000;
    auVar139._16_4_ = 0xbf000000;
    auVar139._20_4_ = 0xbf000000;
    auVar139._24_4_ = 0xbf000000;
    auVar139._28_4_ = 0xbf000000;
    auVar131 = vmulps_avx512vl(auVar140,auVar139);
    fVar273 = auVar126._0_4_;
    fVar278 = auVar126._4_4_;
    fVar279 = auVar126._8_4_;
    fVar280 = auVar126._12_4_;
    fVar251 = auVar126._16_4_;
    fVar252 = auVar126._20_4_;
    fVar253 = auVar126._24_4_;
    auVar144._4_4_ = fVar278 * fVar278 * fVar278 * auVar131._4_4_;
    auVar144._0_4_ = fVar273 * fVar273 * fVar273 * auVar131._0_4_;
    auVar144._8_4_ = fVar279 * fVar279 * fVar279 * auVar131._8_4_;
    auVar144._12_4_ = fVar280 * fVar280 * fVar280 * auVar131._12_4_;
    auVar144._16_4_ = fVar251 * fVar251 * fVar251 * auVar131._16_4_;
    auVar144._20_4_ = fVar252 * fVar252 * fVar252 * auVar131._20_4_;
    auVar144._24_4_ = fVar253 * fVar253 * fVar253 * auVar131._24_4_;
    auVar144._28_4_ = auVar141._28_4_;
    auVar140._8_4_ = 0x3fc00000;
    auVar140._0_8_ = 0x3fc000003fc00000;
    auVar140._12_4_ = 0x3fc00000;
    auVar140._16_4_ = 0x3fc00000;
    auVar140._20_4_ = 0x3fc00000;
    auVar140._24_4_ = 0x3fc00000;
    auVar140._28_4_ = 0x3fc00000;
    auVar126 = vfmadd231ps_avx512vl(auVar144,auVar126,auVar140);
    auVar131 = vmulps_avx512vl(auVar121,auVar126);
    auVar138 = vmulps_avx512vl(auVar124,auVar126);
    auVar139 = vmulps_avx512vl(auVar125,auVar126);
    auVar140 = vsubps_avx512vl(auVar304,auVar127);
    auVar141 = vsubps_avx512vl(auVar304,auVar128);
    auVar142 = vsubps_avx512vl(auVar304,auVar129);
    auVar143 = vmulps_avx512vl(local_840,auVar142);
    auVar143 = vfmadd231ps_avx512vl(auVar143,local_6a0,auVar141);
    auVar143 = vfmadd231ps_avx512vl(auVar143,local_820,auVar140);
    auVar144 = vmulps_avx512vl(auVar142,auVar142);
    auVar144 = vfmadd231ps_avx512vl(auVar144,auVar141,auVar141);
    auVar144 = vfmadd231ps_avx512vl(auVar144,auVar140,auVar140);
    auVar145 = vmulps_avx512vl(local_840,auVar139);
    auVar145 = vfmadd231ps_avx512vl(auVar145,auVar138,local_6a0);
    auVar145 = vfmadd231ps_avx512vl(auVar145,auVar131,local_820);
    auVar139 = vmulps_avx512vl(auVar142,auVar139);
    auVar138 = vfmadd231ps_avx512vl(auVar139,auVar141,auVar138);
    auVar131 = vfmadd231ps_avx512vl(auVar138,auVar140,auVar131);
    auVar138 = vmulps_avx512vl(auVar145,auVar145);
    auVar139 = vsubps_avx512vl(local_560,auVar138);
    auVar146 = vmulps_avx512vl(auVar145,auVar131);
    auVar143 = vsubps_avx512vl(auVar143,auVar146);
    auVar143 = vaddps_avx512vl(auVar143,auVar143);
    auVar146 = vmulps_avx512vl(auVar131,auVar131);
    local_a40 = vsubps_avx512vl(auVar144,auVar146);
    auVar120 = vsubps_avx512vl(local_a40,auVar120);
    auVar144 = vmulps_avx512vl(auVar143,auVar143);
    _local_aa0 = vmulps_avx512vl(auVar139,auVar122);
    auVar146 = vmulps_avx512vl(_local_aa0,auVar120);
    auVar146 = vsubps_avx512vl(auVar144,auVar146);
    auVar104 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
    uVar83 = vcmpps_avx512vl(auVar146,auVar304,5);
    bVar72 = (byte)uVar83;
    if (bVar72 == 0) {
LAB_018dba8f:
      auVar264 = ZEXT3264(_DAT_01f7b040);
      auVar123 = vmovdqa64_avx512vl(auVar109);
      auVar302 = ZEXT3264(auVar123);
      auVar123 = vmovdqa64_avx512vl(auVar110);
      auVar303 = ZEXT3264(auVar123);
    }
    else {
      local_7c0._0_32_ = auVar144;
      auVar146 = vsqrtps_avx512vl(auVar146);
      local_ac0 = vaddps_avx512vl(auVar139,auVar139);
      _local_880 = vrcp14ps_avx512vl(local_ac0);
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = 0x3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar122._16_4_ = 0x3f800000;
      auVar122._20_4_ = 0x3f800000;
      auVar122._24_4_ = 0x3f800000;
      auVar122._28_4_ = 0x3f800000;
      auVar122 = vfnmadd213ps_avx512vl(_local_880,local_ac0,auVar122);
      auVar122 = vfmadd132ps_avx512vl(auVar122,_local_880,_local_880);
      local_8a0 = vxorps_avx512vl(auVar143,auVar130);
      auVar130 = vsubps_avx512vl(local_8a0,auVar146);
      local_860 = vmulps_avx512vl(auVar130,auVar122);
      auVar130 = vsubps_avx512vl(auVar146,auVar143);
      local_8c0 = vmulps_avx512vl(auVar130,auVar122);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar122 = vblendmps_avx512vl(auVar130,local_860);
      auVar147._0_4_ =
           (uint)(bVar72 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar130._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar147._4_4_ = (uint)bVar82 * auVar122._4_4_ | (uint)!bVar82 * auVar130._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar147._8_4_ = (uint)bVar82 * auVar122._8_4_ | (uint)!bVar82 * auVar130._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar147._12_4_ = (uint)bVar82 * auVar122._12_4_ | (uint)!bVar82 * auVar130._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar147._16_4_ = (uint)bVar82 * auVar122._16_4_ | (uint)!bVar82 * auVar130._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar147._20_4_ = (uint)bVar82 * auVar122._20_4_ | (uint)!bVar82 * auVar130._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar147._24_4_ = (uint)bVar82 * auVar122._24_4_ | (uint)!bVar82 * auVar130._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar147._28_4_ = (uint)bVar82 * auVar122._28_4_ | (uint)!bVar82 * auVar130._28_4_;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar130,local_8c0);
      auVar148._0_4_ =
           (uint)(bVar72 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar130._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar148._4_4_ = (uint)bVar82 * auVar122._4_4_ | (uint)!bVar82 * auVar130._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar148._8_4_ = (uint)bVar82 * auVar122._8_4_ | (uint)!bVar82 * auVar130._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar148._12_4_ = (uint)bVar82 * auVar122._12_4_ | (uint)!bVar82 * auVar130._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar148._16_4_ = (uint)bVar82 * auVar122._16_4_ | (uint)!bVar82 * auVar130._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar148._20_4_ = (uint)bVar82 * auVar122._20_4_ | (uint)!bVar82 * auVar130._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar148._24_4_ = (uint)bVar82 * auVar122._24_4_ | (uint)!bVar82 * auVar130._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar148._28_4_ = (uint)bVar82 * auVar122._28_4_ | (uint)!bVar82 * auVar130._28_4_;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar138,auVar130);
      local_8e0 = vmaxps_avx512vl(local_580,auVar130);
      auVar304._8_4_ = 0x36000000;
      auVar304._0_8_ = 0x3600000036000000;
      auVar304._12_4_ = 0x36000000;
      auVar304._16_4_ = 0x36000000;
      auVar304._20_4_ = 0x36000000;
      auVar304._24_4_ = 0x36000000;
      auVar304._28_4_ = 0x36000000;
      local_980 = vmulps_avx512vl(local_8e0,auVar304);
      vandps_avx512vl(auVar139,auVar130);
      uVar27 = vcmpps_avx512vl(local_980,local_980,1);
      uVar83 = uVar83 & uVar27;
      bVar79 = (byte)uVar83;
      if (bVar79 != 0) {
        uVar27 = vcmpps_avx512vl(auVar120,ZEXT1632(auVar104),2);
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar138 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar139 = vblendmps_avx512vl(auVar120,auVar138);
        bVar78 = (byte)uVar27;
        uVar84 = (uint)(bVar78 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar78 & 1) * local_980._0_4_;
        bVar82 = (bool)((byte)(uVar27 >> 1) & 1);
        uVar163 = (uint)bVar82 * auVar139._4_4_ | (uint)!bVar82 * local_980._4_4_;
        bVar82 = (bool)((byte)(uVar27 >> 2) & 1);
        uVar164 = (uint)bVar82 * auVar139._8_4_ | (uint)!bVar82 * local_980._8_4_;
        bVar82 = (bool)((byte)(uVar27 >> 3) & 1);
        uVar165 = (uint)bVar82 * auVar139._12_4_ | (uint)!bVar82 * local_980._12_4_;
        bVar82 = (bool)((byte)(uVar27 >> 4) & 1);
        uVar166 = (uint)bVar82 * auVar139._16_4_ | (uint)!bVar82 * local_980._16_4_;
        bVar82 = (bool)((byte)(uVar27 >> 5) & 1);
        uVar167 = (uint)bVar82 * auVar139._20_4_ | (uint)!bVar82 * local_980._20_4_;
        bVar82 = (bool)((byte)(uVar27 >> 6) & 1);
        uVar168 = (uint)bVar82 * auVar139._24_4_ | (uint)!bVar82 * local_980._24_4_;
        bVar82 = SUB81(uVar27 >> 7,0);
        uVar169 = (uint)bVar82 * auVar139._28_4_ | (uint)!bVar82 * local_980._28_4_;
        auVar147._0_4_ = (bVar79 & 1) * uVar84 | !(bool)(bVar79 & 1) * auVar147._0_4_;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar147._4_4_ = bVar82 * uVar163 | !bVar82 * auVar147._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar147._8_4_ = bVar82 * uVar164 | !bVar82 * auVar147._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar147._12_4_ = bVar82 * uVar165 | !bVar82 * auVar147._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar147._16_4_ = bVar82 * uVar166 | !bVar82 * auVar147._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar147._20_4_ = bVar82 * uVar167 | !bVar82 * auVar147._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar147._24_4_ = bVar82 * uVar168 | !bVar82 * auVar147._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar147._28_4_ = bVar82 * uVar169 | !bVar82 * auVar147._28_4_;
        auVar120 = vblendmps_avx512vl(auVar138,auVar120);
        bVar82 = (bool)((byte)(uVar27 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar27 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar27 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar27 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar27 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar27 >> 6) & 1);
        bVar17 = SUB81(uVar27 >> 7,0);
        auVar148._0_4_ =
             (uint)(bVar79 & 1) *
             ((uint)(bVar78 & 1) * auVar120._0_4_ | !(bool)(bVar78 & 1) * uVar84) |
             !(bool)(bVar79 & 1) * auVar148._0_4_;
        bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar148._4_4_ =
             (uint)bVar11 * ((uint)bVar82 * auVar120._4_4_ | !bVar82 * uVar163) |
             !bVar11 * auVar148._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar148._8_4_ =
             (uint)bVar82 * ((uint)bVar12 * auVar120._8_4_ | !bVar12 * uVar164) |
             !bVar82 * auVar148._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar148._12_4_ =
             (uint)bVar82 * ((uint)bVar13 * auVar120._12_4_ | !bVar13 * uVar165) |
             !bVar82 * auVar148._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar148._16_4_ =
             (uint)bVar82 * ((uint)bVar14 * auVar120._16_4_ | !bVar14 * uVar166) |
             !bVar82 * auVar148._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar148._20_4_ =
             (uint)bVar82 * ((uint)bVar15 * auVar120._20_4_ | !bVar15 * uVar167) |
             !bVar82 * auVar148._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar148._24_4_ =
             (uint)bVar82 * ((uint)bVar16 * auVar120._24_4_ | !bVar16 * uVar168) |
             !bVar82 * auVar148._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar148._28_4_ =
             (uint)bVar82 * ((uint)bVar17 * auVar120._28_4_ | !bVar17 * uVar169) |
             !bVar82 * auVar148._28_4_;
        bVar72 = (~bVar79 | bVar78) & bVar72;
      }
      if ((bVar72 & 0x7f) == 0) {
        auVar264 = ZEXT3264(_DAT_01f7b040);
        auVar123 = vmovdqa64_avx512vl(auVar109);
        auVar302 = ZEXT3264(auVar123);
        auVar123 = vmovdqa64_avx512vl(auVar110);
        auVar303 = ZEXT3264(auVar123);
      }
      else {
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar138 = vxorps_avx512vl(auVar137,auVar120);
        auVar139 = vxorps_avx512vl(auVar135,auVar120);
        auVar162 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        auVar130 = vxorps_avx512vl(auVar136,auVar120);
        auVar104 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                  ZEXT416((uint)local_950._0_4_));
        auVar135 = vbroadcastss_avx512vl(auVar104);
        auVar135 = vminps_avx512vl(auVar135,auVar148);
        auVar71._4_4_ = fStack_61c;
        auVar71._0_4_ = local_620;
        auVar71._8_4_ = fStack_618;
        auVar71._12_4_ = fStack_614;
        auVar71._16_4_ = fStack_610;
        auVar71._20_4_ = fStack_60c;
        auVar71._24_4_ = fStack_608;
        auVar71._28_4_ = fStack_604;
        auVar136 = vmaxps_avx512vl(auVar71,auVar147);
        auVar137 = vmulps_avx512vl(auVar151,auVar142);
        auVar137 = vfmadd213ps_avx512vl(auVar141,auVar150,auVar137);
        auVar104 = vfmadd213ps_fma(auVar140,auVar149,auVar137);
        auVar140 = vmulps_avx512vl(local_840,auVar151);
        auVar140 = vfmadd231ps_avx512vl(auVar140,local_6a0,auVar150);
        auVar140 = vfmadd231ps_avx512vl(auVar140,local_820,auVar149);
        auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar140,auVar137);
        auVar141 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar26 = vcmpps_avx512vl(auVar137,auVar141,1);
        auVar142 = vxorps_avx512vl(ZEXT1632(auVar104),auVar120);
        auVar149 = vrcp14ps_avx512vl(auVar140);
        auVar150 = vxorps_avx512vl(auVar140,auVar120);
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar122 = vfnmadd213ps_avx512vl(auVar149,auVar140,auVar151);
        auVar104 = vfmadd132ps_fma(auVar122,auVar149,auVar149);
        fVar273 = auVar104._0_4_ * auVar142._0_4_;
        fVar278 = auVar104._4_4_ * auVar142._4_4_;
        auVar42._4_4_ = fVar278;
        auVar42._0_4_ = fVar273;
        fVar279 = auVar104._8_4_ * auVar142._8_4_;
        auVar42._8_4_ = fVar279;
        fVar280 = auVar104._12_4_ * auVar142._12_4_;
        auVar42._12_4_ = fVar280;
        fVar251 = auVar142._16_4_ * 0.0;
        auVar42._16_4_ = fVar251;
        fVar252 = auVar142._20_4_ * 0.0;
        auVar42._20_4_ = fVar252;
        fVar253 = auVar142._24_4_ * 0.0;
        auVar42._24_4_ = fVar253;
        auVar42._28_4_ = auVar142._28_4_;
        uVar29 = vcmpps_avx512vl(auVar140,auVar150,1);
        bVar79 = (byte)uVar26 | (byte)uVar29;
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar146 = vblendmps_avx512vl(auVar42,auVar122);
        auVar152._0_4_ =
             (uint)(bVar79 & 1) * auVar146._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar149._0_4_;
        bVar82 = (bool)(bVar79 >> 1 & 1);
        auVar152._4_4_ = (uint)bVar82 * auVar146._4_4_ | (uint)!bVar82 * auVar149._4_4_;
        bVar82 = (bool)(bVar79 >> 2 & 1);
        auVar152._8_4_ = (uint)bVar82 * auVar146._8_4_ | (uint)!bVar82 * auVar149._8_4_;
        bVar82 = (bool)(bVar79 >> 3 & 1);
        auVar152._12_4_ = (uint)bVar82 * auVar146._12_4_ | (uint)!bVar82 * auVar149._12_4_;
        bVar82 = (bool)(bVar79 >> 4 & 1);
        auVar152._16_4_ = (uint)bVar82 * auVar146._16_4_ | (uint)!bVar82 * auVar149._16_4_;
        bVar82 = (bool)(bVar79 >> 5 & 1);
        auVar152._20_4_ = (uint)bVar82 * auVar146._20_4_ | (uint)!bVar82 * auVar149._20_4_;
        bVar82 = (bool)(bVar79 >> 6 & 1);
        auVar152._24_4_ = (uint)bVar82 * auVar146._24_4_ | (uint)!bVar82 * auVar149._24_4_;
        auVar152._28_4_ =
             (uint)(bVar79 >> 7) * auVar146._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar149._28_4_;
        auVar149 = vmaxps_avx512vl(auVar136,auVar152);
        auVar294 = ZEXT3264(auVar149);
        uVar29 = vcmpps_avx512vl(auVar140,auVar150,6);
        bVar79 = (byte)uVar26 | (byte)uVar29;
        auVar153._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * (int)fVar273;
        bVar82 = (bool)(bVar79 >> 1 & 1);
        auVar153._4_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar278;
        bVar82 = (bool)(bVar79 >> 2 & 1);
        auVar153._8_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar279;
        bVar82 = (bool)(bVar79 >> 3 & 1);
        auVar153._12_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar280;
        bVar82 = (bool)(bVar79 >> 4 & 1);
        auVar153._16_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar251;
        bVar82 = (bool)(bVar79 >> 5 & 1);
        auVar153._20_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar252;
        bVar82 = (bool)(bVar79 >> 6 & 1);
        auVar153._24_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar253;
        auVar153._28_4_ =
             (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar142._28_4_;
        auVar140 = vminps_avx512vl(auVar135,auVar153);
        auVar104 = vxorps_avx512vl(auVar136._0_16_,auVar136._0_16_);
        auVar132 = vsubps_avx512vl(ZEXT1632(auVar104),auVar132);
        auVar133 = vsubps_avx512vl(ZEXT1632(auVar104),auVar133);
        auVar135 = ZEXT1632(auVar104);
        auVar134 = vsubps_avx512vl(auVar135,auVar134);
        auVar134 = vmulps_avx512vl(auVar134,auVar138);
        auVar133 = vfmadd231ps_avx512vl(auVar134,auVar130,auVar133);
        auVar132 = vfmadd231ps_avx512vl(auVar133,auVar139,auVar132);
        auVar138 = vmulps_avx512vl(local_840,auVar138);
        auVar138 = vfmadd231ps_avx512vl(auVar138,local_6a0,auVar130);
        auVar138 = vfmadd231ps_avx512vl(auVar138,local_820,auVar139);
        vandps_avx512vl(auVar138,auVar137);
        uVar26 = vcmpps_avx512vl(auVar138,auVar141,1);
        auVar139 = vxorps_avx512vl(auVar132,auVar120);
        auVar130 = vrcp14ps_avx512vl(auVar138);
        auVar120 = vxorps_avx512vl(auVar138,auVar120);
        auVar289 = ZEXT3264(auVar120);
        auVar132 = vfnmadd213ps_avx512vl(auVar130,auVar138,auVar151);
        auVar104 = vfmadd132ps_fma(auVar132,auVar130,auVar130);
        fVar273 = auVar104._0_4_ * auVar139._0_4_;
        fVar278 = auVar104._4_4_ * auVar139._4_4_;
        auVar43._4_4_ = fVar278;
        auVar43._0_4_ = fVar273;
        fVar279 = auVar104._8_4_ * auVar139._8_4_;
        auVar43._8_4_ = fVar279;
        fVar280 = auVar104._12_4_ * auVar139._12_4_;
        auVar43._12_4_ = fVar280;
        fVar251 = auVar139._16_4_ * 0.0;
        auVar43._16_4_ = fVar251;
        fVar252 = auVar139._20_4_ * 0.0;
        auVar43._20_4_ = fVar252;
        fVar253 = auVar139._24_4_ * 0.0;
        auVar43._24_4_ = fVar253;
        auVar43._28_4_ = auVar139._28_4_;
        uVar29 = vcmpps_avx512vl(auVar138,auVar120,1);
        bVar79 = (byte)uVar26 | (byte)uVar29;
        auVar132 = vblendmps_avx512vl(auVar43,auVar122);
        auVar154._0_4_ =
             (uint)(bVar79 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar130._0_4_;
        bVar82 = (bool)(bVar79 >> 1 & 1);
        auVar154._4_4_ = (uint)bVar82 * auVar132._4_4_ | (uint)!bVar82 * auVar130._4_4_;
        bVar82 = (bool)(bVar79 >> 2 & 1);
        auVar154._8_4_ = (uint)bVar82 * auVar132._8_4_ | (uint)!bVar82 * auVar130._8_4_;
        bVar82 = (bool)(bVar79 >> 3 & 1);
        auVar154._12_4_ = (uint)bVar82 * auVar132._12_4_ | (uint)!bVar82 * auVar130._12_4_;
        bVar82 = (bool)(bVar79 >> 4 & 1);
        auVar154._16_4_ = (uint)bVar82 * auVar132._16_4_ | (uint)!bVar82 * auVar130._16_4_;
        bVar82 = (bool)(bVar79 >> 5 & 1);
        auVar154._20_4_ = (uint)bVar82 * auVar132._20_4_ | (uint)!bVar82 * auVar130._20_4_;
        bVar82 = (bool)(bVar79 >> 6 & 1);
        auVar154._24_4_ = (uint)bVar82 * auVar132._24_4_ | (uint)!bVar82 * auVar130._24_4_;
        auVar154._28_4_ =
             (uint)(bVar79 >> 7) * auVar132._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar130._28_4_;
        local_800 = vmaxps_avx(auVar149,auVar154);
        auVar286 = ZEXT3264(local_800);
        uVar29 = vcmpps_avx512vl(auVar138,auVar120,6);
        bVar79 = (byte)uVar26 | (byte)uVar29;
        auVar155._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * (int)fVar273;
        bVar82 = (bool)(bVar79 >> 1 & 1);
        auVar155._4_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar278;
        bVar82 = (bool)(bVar79 >> 2 & 1);
        auVar155._8_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar279;
        bVar82 = (bool)(bVar79 >> 3 & 1);
        auVar155._12_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar280;
        bVar82 = (bool)(bVar79 >> 4 & 1);
        auVar155._16_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar251;
        bVar82 = (bool)(bVar79 >> 5 & 1);
        auVar155._20_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar252;
        bVar82 = (bool)(bVar79 >> 6 & 1);
        auVar155._24_4_ = (uint)bVar82 * 0x7f800000 | (uint)!bVar82 * (int)fVar253;
        auVar155._28_4_ =
             (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar139._28_4_;
        local_660 = vminps_avx(auVar140,auVar155);
        auVar189 = ZEXT3264(local_660);
        uVar26 = vcmpps_avx512vl(local_800,local_660,2);
        bVar72 = bVar72 & 0x7f & (byte)uVar26;
        if (bVar72 == 0) goto LAB_018dba8f;
        auVar120 = vmaxps_avx512vl(auVar135,auVar123);
        auVar123 = vfmadd213ps_avx512vl(local_860,auVar145,auVar131);
        fVar273 = auVar126._0_4_;
        fVar278 = auVar126._4_4_;
        auVar44._4_4_ = fVar278 * auVar123._4_4_;
        auVar44._0_4_ = fVar273 * auVar123._0_4_;
        fVar279 = auVar126._8_4_;
        auVar44._8_4_ = fVar279 * auVar123._8_4_;
        fVar280 = auVar126._12_4_;
        auVar44._12_4_ = fVar280 * auVar123._12_4_;
        fVar251 = auVar126._16_4_;
        auVar44._16_4_ = fVar251 * auVar123._16_4_;
        fVar252 = auVar126._20_4_;
        auVar44._20_4_ = fVar252 * auVar123._20_4_;
        fVar253 = auVar126._24_4_;
        auVar44._24_4_ = fVar253 * auVar123._24_4_;
        auVar44._28_4_ = auVar123._28_4_;
        auVar123 = vfmadd213ps_avx512vl(local_8c0,auVar145,auVar131);
        auVar45._4_4_ = fVar278 * auVar123._4_4_;
        auVar45._0_4_ = fVar273 * auVar123._0_4_;
        auVar45._8_4_ = fVar279 * auVar123._8_4_;
        auVar45._12_4_ = fVar280 * auVar123._12_4_;
        auVar45._16_4_ = fVar251 * auVar123._16_4_;
        auVar45._20_4_ = fVar252 * auVar123._20_4_;
        auVar45._24_4_ = fVar253 * auVar123._24_4_;
        auVar45._28_4_ = auVar123._28_4_;
        auVar123 = vminps_avx512vl(auVar44,auVar151);
        auVar138 = ZEXT832(0) << 0x20;
        auVar123 = vmaxps_avx(auVar123,ZEXT832(0) << 0x20);
        auVar139 = vminps_avx512vl(auVar45,auVar151);
        auVar46._4_4_ = (auVar123._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar123._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar123._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar123._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar123._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar123._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar123._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar123._28_4_ + 7.0;
        local_4e0 = vfmadd213ps_avx512vl(auVar46,auVar180,local_a80);
        auVar123 = vmaxps_avx(auVar139,ZEXT832(0) << 0x20);
        auVar47._4_4_ = (auVar123._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar123._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar123._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar123._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar123._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar123._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar123._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar123._28_4_ + 7.0;
        local_500 = vfmadd213ps_avx512vl(auVar47,auVar180,local_a80);
        auVar48._4_4_ = auVar120._4_4_ * auVar120._4_4_;
        auVar48._0_4_ = auVar120._0_4_ * auVar120._0_4_;
        auVar48._8_4_ = auVar120._8_4_ * auVar120._8_4_;
        auVar48._12_4_ = auVar120._12_4_ * auVar120._12_4_;
        auVar48._16_4_ = auVar120._16_4_ * auVar120._16_4_;
        auVar48._20_4_ = auVar120._20_4_ * auVar120._20_4_;
        auVar48._24_4_ = auVar120._24_4_ * auVar120._24_4_;
        auVar48._28_4_ = auVar120._28_4_;
        auVar123 = vsubps_avx(local_a40,auVar48);
        auVar294 = ZEXT3264(auVar123);
        auVar49._4_4_ = auVar123._4_4_ * (float)local_aa0._4_4_;
        auVar49._0_4_ = auVar123._0_4_ * (float)local_aa0._0_4_;
        auVar49._8_4_ = auVar123._8_4_ * fStack_a98;
        auVar49._12_4_ = auVar123._12_4_ * fStack_a94;
        auVar49._16_4_ = auVar123._16_4_ * fStack_a90;
        auVar49._20_4_ = auVar123._20_4_ * fStack_a8c;
        auVar49._24_4_ = auVar123._24_4_ * fStack_a88;
        auVar49._28_4_ = auVar120._28_4_;
        auVar120 = vsubps_avx(auVar144,auVar49);
        uVar26 = vcmpps_avx512vl(auVar120,ZEXT832(0) << 0x20,5);
        bVar79 = (byte)uVar26;
        if (bVar79 == 0) {
          bVar79 = 0;
          auVar121 = ZEXT832(0) << 0x20;
          auVar124 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar120 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar139 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar286 = ZEXT864(0) << 0x20;
          auVar156._8_4_ = 0x7f800000;
          auVar156._0_8_ = 0x7f8000007f800000;
          auVar156._12_4_ = 0x7f800000;
          auVar156._16_4_ = 0x7f800000;
          auVar156._20_4_ = 0x7f800000;
          auVar156._24_4_ = 0x7f800000;
          auVar156._28_4_ = 0x7f800000;
          auVar157._8_4_ = 0xff800000;
          auVar157._0_8_ = 0xff800000ff800000;
          auVar157._12_4_ = 0xff800000;
          auVar157._16_4_ = 0xff800000;
          auVar157._20_4_ = 0xff800000;
          auVar157._24_4_ = 0xff800000;
          auVar157._28_4_ = 0xff800000;
        }
        else {
          auVar98 = vxorps_avx512vl(auVar173,auVar173);
          uVar83 = vcmpps_avx512vl(auVar120,auVar135,5);
          auVar120 = vsqrtps_avx(auVar120);
          auVar138 = vfnmadd213ps_avx512vl(local_ac0,_local_880,auVar151);
          auVar104 = vfmadd132ps_fma(auVar138,_local_880,_local_880);
          auVar138 = vsubps_avx(local_8a0,auVar120);
          auVar50._4_4_ = auVar104._4_4_ * auVar138._4_4_;
          auVar50._0_4_ = auVar104._0_4_ * auVar138._0_4_;
          auVar50._8_4_ = auVar104._8_4_ * auVar138._8_4_;
          auVar50._12_4_ = auVar104._12_4_ * auVar138._12_4_;
          auVar50._16_4_ = auVar138._16_4_ * 0.0;
          auVar50._20_4_ = auVar138._20_4_ * 0.0;
          auVar50._24_4_ = auVar138._24_4_ * 0.0;
          auVar50._28_4_ = 0x3e000000;
          auVar120 = vsubps_avx512vl(auVar120,auVar143);
          auVar51._4_4_ = auVar104._4_4_ * auVar120._4_4_;
          auVar51._0_4_ = auVar104._0_4_ * auVar120._0_4_;
          auVar51._8_4_ = auVar104._8_4_ * auVar120._8_4_;
          auVar51._12_4_ = auVar104._12_4_ * auVar120._12_4_;
          auVar51._16_4_ = auVar120._16_4_ * 0.0;
          auVar51._20_4_ = auVar120._20_4_ * 0.0;
          auVar51._24_4_ = auVar120._24_4_ * 0.0;
          auVar51._28_4_ = uVar196;
          auVar120 = vfmadd213ps_avx512vl(auVar145,auVar50,auVar131);
          auVar285._0_4_ = fVar273 * auVar120._0_4_;
          auVar285._4_4_ = fVar278 * auVar120._4_4_;
          auVar285._8_4_ = fVar279 * auVar120._8_4_;
          auVar285._12_4_ = fVar280 * auVar120._12_4_;
          auVar285._16_4_ = fVar251 * auVar120._16_4_;
          auVar285._20_4_ = fVar252 * auVar120._20_4_;
          auVar285._24_4_ = fVar253 * auVar120._24_4_;
          auVar285._28_4_ = 0;
          auVar120 = vmulps_avx512vl(local_820,auVar50);
          auVar138 = vmulps_avx512vl(local_6a0,auVar50);
          auVar140 = vmulps_avx512vl(local_840,auVar50);
          auVar139 = vfmadd213ps_avx512vl(auVar121,auVar285,auVar127);
          auVar120 = vsubps_avx512vl(auVar120,auVar139);
          auVar139 = vfmadd213ps_avx512vl(auVar124,auVar285,auVar128);
          auVar139 = vsubps_avx512vl(auVar138,auVar139);
          auVar104 = vfmadd213ps_fma(auVar285,auVar125,auVar129);
          auVar138 = vsubps_avx(auVar140,ZEXT1632(auVar104));
          auVar286 = ZEXT3264(auVar138);
          auVar131 = vfmadd213ps_avx512vl(auVar145,auVar51,auVar131);
          auVar126 = vmulps_avx512vl(auVar126,auVar131);
          auVar131 = vmulps_avx512vl(local_820,auVar51);
          auVar140 = vmulps_avx512vl(local_6a0,auVar51);
          auVar130 = vmulps_avx512vl(local_840,auVar51);
          auVar104 = vfmadd213ps_fma(auVar121,auVar126,auVar127);
          auVar138 = vsubps_avx(auVar131,ZEXT1632(auVar104));
          auVar104 = vfmadd213ps_fma(auVar124,auVar126,auVar128);
          auVar121 = vsubps_avx512vl(auVar140,ZEXT1632(auVar104));
          auVar104 = vfmadd213ps_fma(auVar125,auVar126,auVar129);
          auVar124 = vsubps_avx512vl(auVar130,ZEXT1632(auVar104));
          auVar181._8_4_ = 0x7f800000;
          auVar181._0_8_ = 0x7f8000007f800000;
          auVar181._12_4_ = 0x7f800000;
          auVar181._16_4_ = 0x7f800000;
          auVar181._20_4_ = 0x7f800000;
          auVar181._24_4_ = 0x7f800000;
          auVar181._28_4_ = 0x7f800000;
          auVar125 = vblendmps_avx512vl(auVar181,auVar50);
          bVar82 = (bool)((byte)uVar83 & 1);
          auVar156._0_4_ = (uint)bVar82 * auVar125._0_4_ | (uint)!bVar82 * auVar127._0_4_;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar156._4_4_ = (uint)bVar82 * auVar125._4_4_ | (uint)!bVar82 * auVar127._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar156._8_4_ = (uint)bVar82 * auVar125._8_4_ | (uint)!bVar82 * auVar127._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar156._12_4_ = (uint)bVar82 * auVar125._12_4_ | (uint)!bVar82 * auVar127._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar156._16_4_ = (uint)bVar82 * auVar125._16_4_ | (uint)!bVar82 * auVar127._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar156._20_4_ = (uint)bVar82 * auVar125._20_4_ | (uint)!bVar82 * auVar127._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar156._24_4_ = (uint)bVar82 * auVar125._24_4_ | (uint)!bVar82 * auVar127._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar156._28_4_ = (uint)bVar82 * auVar125._28_4_ | (uint)!bVar82 * auVar127._28_4_;
          auVar182._8_4_ = 0xff800000;
          auVar182._0_8_ = 0xff800000ff800000;
          auVar182._12_4_ = 0xff800000;
          auVar182._16_4_ = 0xff800000;
          auVar182._20_4_ = 0xff800000;
          auVar182._24_4_ = 0xff800000;
          auVar182._28_4_ = 0xff800000;
          auVar125 = vblendmps_avx512vl(auVar182,auVar51);
          bVar82 = (bool)((byte)uVar83 & 1);
          auVar157._0_4_ = (uint)bVar82 * auVar125._0_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar157._4_4_ = (uint)bVar82 * auVar125._4_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar157._8_4_ = (uint)bVar82 * auVar125._8_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar157._12_4_ = (uint)bVar82 * auVar125._12_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar157._16_4_ = (uint)bVar82 * auVar125._16_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar157._20_4_ = (uint)bVar82 * auVar125._20_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar157._24_4_ = (uint)bVar82 * auVar125._24_4_ | (uint)!bVar82 * -0x800000;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar157._28_4_ = (uint)bVar82 * auVar125._28_4_ | (uint)!bVar82 * -0x800000;
          auVar38._8_4_ = 0x36000000;
          auVar38._0_8_ = 0x3600000036000000;
          auVar38._12_4_ = 0x36000000;
          auVar38._16_4_ = 0x36000000;
          auVar38._20_4_ = 0x36000000;
          auVar38._24_4_ = 0x36000000;
          auVar38._28_4_ = 0x36000000;
          auVar125 = vmulps_avx512vl(local_8e0,auVar38);
          uVar27 = vcmpps_avx512vl(auVar125,local_980,0xe);
          uVar83 = uVar83 & uVar27;
          bVar78 = (byte)uVar83;
          if (bVar78 != 0) {
            uVar27 = vcmpps_avx512vl(auVar123,ZEXT1632(auVar98),2);
            auVar276._8_4_ = 0x7f800000;
            auVar276._0_8_ = 0x7f8000007f800000;
            auVar276._12_4_ = 0x7f800000;
            auVar276._16_4_ = 0x7f800000;
            auVar276._20_4_ = 0x7f800000;
            auVar276._24_4_ = 0x7f800000;
            auVar276._28_4_ = 0x7f800000;
            auVar293._8_4_ = 0xff800000;
            auVar293._0_8_ = 0xff800000ff800000;
            auVar293._12_4_ = 0xff800000;
            auVar293._16_4_ = 0xff800000;
            auVar293._20_4_ = 0xff800000;
            auVar293._24_4_ = 0xff800000;
            auVar293._28_4_ = 0xff800000;
            auVar294 = ZEXT3264(auVar293);
            auVar123 = vblendmps_avx512vl(auVar276,auVar293);
            bVar73 = (byte)uVar27;
            uVar84 = (uint)(bVar73 & 1) * auVar123._0_4_ |
                     (uint)!(bool)(bVar73 & 1) * auVar125._0_4_;
            bVar82 = (bool)((byte)(uVar27 >> 1) & 1);
            uVar163 = (uint)bVar82 * auVar123._4_4_ | (uint)!bVar82 * auVar125._4_4_;
            bVar82 = (bool)((byte)(uVar27 >> 2) & 1);
            uVar164 = (uint)bVar82 * auVar123._8_4_ | (uint)!bVar82 * auVar125._8_4_;
            bVar82 = (bool)((byte)(uVar27 >> 3) & 1);
            uVar165 = (uint)bVar82 * auVar123._12_4_ | (uint)!bVar82 * auVar125._12_4_;
            bVar82 = (bool)((byte)(uVar27 >> 4) & 1);
            uVar166 = (uint)bVar82 * auVar123._16_4_ | (uint)!bVar82 * auVar125._16_4_;
            bVar82 = (bool)((byte)(uVar27 >> 5) & 1);
            uVar167 = (uint)bVar82 * auVar123._20_4_ | (uint)!bVar82 * auVar125._20_4_;
            bVar82 = (bool)((byte)(uVar27 >> 6) & 1);
            uVar168 = (uint)bVar82 * auVar123._24_4_ | (uint)!bVar82 * auVar125._24_4_;
            bVar82 = SUB81(uVar27 >> 7,0);
            uVar169 = (uint)bVar82 * auVar123._28_4_ | (uint)!bVar82 * auVar125._28_4_;
            auVar156._0_4_ = (bVar78 & 1) * uVar84 | !(bool)(bVar78 & 1) * auVar156._0_4_;
            bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar156._4_4_ = bVar82 * uVar163 | !bVar82 * auVar156._4_4_;
            bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar156._8_4_ = bVar82 * uVar164 | !bVar82 * auVar156._8_4_;
            bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar156._12_4_ = bVar82 * uVar165 | !bVar82 * auVar156._12_4_;
            bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar156._16_4_ = bVar82 * uVar166 | !bVar82 * auVar156._16_4_;
            bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar156._20_4_ = bVar82 * uVar167 | !bVar82 * auVar156._20_4_;
            bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar156._24_4_ = bVar82 * uVar168 | !bVar82 * auVar156._24_4_;
            bVar82 = SUB81(uVar83 >> 7,0);
            auVar156._28_4_ = bVar82 * uVar169 | !bVar82 * auVar156._28_4_;
            auVar123 = vblendmps_avx512vl(auVar293,auVar276);
            bVar82 = (bool)((byte)(uVar27 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar27 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar27 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar27 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar27 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar27 >> 6) & 1);
            bVar17 = SUB81(uVar27 >> 7,0);
            auVar157._0_4_ =
                 (uint)(bVar78 & 1) *
                 ((uint)(bVar73 & 1) * auVar123._0_4_ | !(bool)(bVar73 & 1) * uVar84) |
                 !(bool)(bVar78 & 1) * auVar157._0_4_;
            bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar157._4_4_ =
                 (uint)bVar11 * ((uint)bVar82 * auVar123._4_4_ | !bVar82 * uVar163) |
                 !bVar11 * auVar157._4_4_;
            bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar157._8_4_ =
                 (uint)bVar82 * ((uint)bVar12 * auVar123._8_4_ | !bVar12 * uVar164) |
                 !bVar82 * auVar157._8_4_;
            bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar157._12_4_ =
                 (uint)bVar82 * ((uint)bVar13 * auVar123._12_4_ | !bVar13 * uVar165) |
                 !bVar82 * auVar157._12_4_;
            bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar157._16_4_ =
                 (uint)bVar82 * ((uint)bVar14 * auVar123._16_4_ | !bVar14 * uVar166) |
                 !bVar82 * auVar157._16_4_;
            bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar157._20_4_ =
                 (uint)bVar82 * ((uint)bVar15 * auVar123._20_4_ | !bVar15 * uVar167) |
                 !bVar82 * auVar157._20_4_;
            bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar157._24_4_ =
                 (uint)bVar82 * ((uint)bVar16 * auVar123._24_4_ | !bVar16 * uVar168) |
                 !bVar82 * auVar157._24_4_;
            bVar82 = SUB81(uVar83 >> 7,0);
            auVar157._28_4_ =
                 (uint)bVar82 * ((uint)bVar17 * auVar123._28_4_ | !bVar17 * uVar169) |
                 !bVar82 * auVar157._28_4_;
            bVar79 = (~bVar78 | bVar73) & bVar79;
          }
        }
        auVar123 = vmovdqa64_avx512vl(auVar109);
        auVar302 = ZEXT3264(auVar123);
        auVar123 = vmovdqa64_avx512vl(auVar110);
        auVar303 = ZEXT3264(auVar123);
        auVar123 = vmulps_avx512vl(local_840,auVar124);
        auVar123 = vfmadd231ps_avx512vl(auVar123,local_6a0,auVar121);
        auVar277 = ZEXT3264(local_6a0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,local_820,auVar138);
        auVar289 = ZEXT3264(local_800);
        _local_540 = local_800;
        local_520 = vminps_avx(local_660,auVar156);
        auVar271._8_4_ = 0x7fffffff;
        auVar271._0_8_ = 0x7fffffff7fffffff;
        auVar271._12_4_ = 0x7fffffff;
        auVar271._16_4_ = 0x7fffffff;
        auVar271._20_4_ = 0x7fffffff;
        auVar271._24_4_ = 0x7fffffff;
        auVar271._28_4_ = 0x7fffffff;
        auVar272 = ZEXT3264(auVar271);
        auVar123 = vandps_avx(auVar123,auVar271);
        _local_720 = vmaxps_avx(local_800,auVar157);
        auVar267._8_4_ = 0x3e99999a;
        auVar267._0_8_ = 0x3e99999a3e99999a;
        auVar267._12_4_ = 0x3e99999a;
        auVar267._16_4_ = 0x3e99999a;
        auVar267._20_4_ = 0x3e99999a;
        auVar267._24_4_ = 0x3e99999a;
        auVar267._28_4_ = 0x3e99999a;
        uVar26 = vcmpps_avx512vl(auVar123,auVar267,1);
        uVar29 = vcmpps_avx512vl(local_800,local_520,2);
        bVar78 = (byte)uVar29 & bVar72;
        uVar28 = vcmpps_avx512vl(_local_720,local_660,2);
        if ((bVar72 & ((byte)uVar28 | (byte)uVar29)) != 0) {
          bVar73 = (byte)uVar26 | ~bVar79;
          auVar123 = vmulps_avx512vl(local_840,auVar286._0_32_);
          auVar104 = vfmadd213ps_fma(auVar139,local_6a0,auVar123);
          auVar123 = vfmadd213ps_avx512vl(auVar120,local_820,ZEXT1632(auVar104));
          auVar123 = vandps_avx(auVar123,auVar271);
          uVar26 = vcmpps_avx512vl(auVar123,auVar267,1);
          bVar79 = (byte)uVar26 | ~bVar79;
          auVar183._8_4_ = 2;
          auVar183._0_8_ = 0x200000002;
          auVar183._12_4_ = 2;
          auVar183._16_4_ = 2;
          auVar183._20_4_ = 2;
          auVar183._24_4_ = 2;
          auVar183._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar123 = vpblendmd_avx512vl(auVar183,auVar39);
          local_640._0_4_ = (uint)(bVar79 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
          bVar82 = (bool)(bVar79 >> 1 & 1);
          local_640._4_4_ = (uint)bVar82 * auVar123._4_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 2 & 1);
          local_640._8_4_ = (uint)bVar82 * auVar123._8_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 3 & 1);
          local_640._12_4_ = (uint)bVar82 * auVar123._12_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 4 & 1);
          local_640._16_4_ = (uint)bVar82 * auVar123._16_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 5 & 1);
          local_640._20_4_ = (uint)bVar82 * auVar123._20_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar79 >> 6 & 1);
          local_640._24_4_ = (uint)bVar82 * auVar123._24_4_ | (uint)!bVar82 * 2;
          local_640._28_4_ = (uint)(bVar79 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
          local_6c0 = vpbroadcastd_avx512vl();
          uVar26 = vpcmpd_avx512vl(local_6c0,local_640,5);
          bVar79 = (byte)uVar26 & bVar78;
          local_700 = local_800._0_4_ + (float)local_7e0._0_4_;
          fStack_6fc = local_800._4_4_ + (float)local_7e0._4_4_;
          fStack_6f8 = local_800._8_4_ + fStack_7d8;
          fStack_6f4 = local_800._12_4_ + fStack_7d4;
          fStack_6f0 = local_800._16_4_ + fStack_7d0;
          fStack_6ec = local_800._20_4_ + fStack_7cc;
          fStack_6e8 = local_800._24_4_ + fStack_7c8;
          fStack_6e4 = local_800._28_4_ + fStack_7c4;
          _local_680 = _local_720;
          while( true ) {
            if (bVar79 == 0) break;
            auVar184._8_4_ = 0x7f800000;
            auVar184._0_8_ = 0x7f8000007f800000;
            auVar184._12_4_ = 0x7f800000;
            auVar184._16_4_ = 0x7f800000;
            auVar184._20_4_ = 0x7f800000;
            auVar184._24_4_ = 0x7f800000;
            auVar184._28_4_ = 0x7f800000;
            auVar123 = vblendmps_avx512vl(auVar184,local_800);
            auVar158._0_4_ =
                 (uint)(bVar79 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 1 & 1);
            auVar158._4_4_ = (uint)bVar82 * auVar123._4_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 2 & 1);
            auVar158._8_4_ = (uint)bVar82 * auVar123._8_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 3 & 1);
            auVar158._12_4_ = (uint)bVar82 * auVar123._12_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 4 & 1);
            auVar158._16_4_ = (uint)bVar82 * auVar123._16_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 5 & 1);
            auVar158._20_4_ = (uint)bVar82 * auVar123._20_4_ | (uint)!bVar82 * 0x7f800000;
            auVar158._24_4_ =
                 (uint)(bVar79 >> 6) * auVar123._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
            auVar158._28_4_ = 0x7f800000;
            auVar123 = vshufps_avx(auVar158,auVar158,0xb1);
            auVar123 = vminps_avx(auVar158,auVar123);
            auVar120 = vshufpd_avx(auVar123,auVar123,5);
            auVar123 = vminps_avx(auVar123,auVar120);
            auVar120 = vpermpd_avx2(auVar123,0x4e);
            auVar123 = vminps_avx(auVar123,auVar120);
            uVar26 = vcmpps_avx512vl(auVar158,auVar123,0);
            bVar74 = (byte)uVar26 & bVar79;
            bVar75 = bVar79;
            if (bVar74 != 0) {
              bVar75 = bVar74;
            }
            iVar30 = 0;
            for (uVar84 = (uint)bVar75; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar30 = iVar30 + 1;
            }
            uVar84 = *(uint *)(local_540 + (uint)(iVar30 << 2));
            fVar273 = auVar102._0_4_;
            auVar104 = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar30 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar30 << 2)));
              auVar277 = ZEXT1664(auVar277._0_16_);
              auVar286 = ZEXT1664(auVar286._0_16_);
              auVar289 = ZEXT1664(auVar289._0_16_);
              auVar294 = ZEXT1664(auVar294._0_16_);
              fVar273 = sqrtf((float)local_a20._0_4_);
              auVar123 = vmovdqa64_avx512vl(auVar110);
              auVar303 = ZEXT3264(auVar123);
              auVar123 = vmovdqa64_avx512vl(auVar109);
              auVar302 = ZEXT3264(auVar123);
              auVar104 = local_a80._0_16_;
            }
            auVar272 = ZEXT464(uVar84);
            auVar3 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
            auVar98 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
            auVar95 = vminps_avx(local_9c0._0_16_,local_a00._0_16_);
            auVar94 = vminps_avx(auVar3,auVar95);
            auVar3 = vmaxps_avx(local_9c0._0_16_,local_a00._0_16_);
            auVar95 = vmaxps_avx(auVar98,auVar3);
            auVar236._8_4_ = 0x7fffffff;
            auVar236._0_8_ = 0x7fffffff7fffffff;
            auVar236._12_4_ = 0x7fffffff;
            auVar98 = vandps_avx(auVar94,auVar236);
            auVar3 = vandps_avx(auVar95,auVar236);
            auVar98 = vmaxps_avx(auVar98,auVar3);
            auVar3 = vmovshdup_avx(auVar98);
            auVar3 = vmaxss_avx(auVar3,auVar98);
            auVar98 = vshufpd_avx(auVar98,auVar98,1);
            auVar98 = vmaxss_avx(auVar98,auVar3);
            fVar278 = auVar98._0_4_ * 1.9073486e-06;
            local_a60._0_4_ = fVar273 * 1.9073486e-06;
            local_940 = vshufps_avx(auVar95,auVar95,0xff);
            auVar104 = vinsertps_avx(ZEXT416(uVar84),auVar104,0x10);
            auVar189 = ZEXT1664(auVar104);
            lVar76 = 5;
            do {
              do {
                bVar82 = lVar76 == 0;
                lVar76 = lVar76 + -1;
                if (bVar82) goto LAB_018dc67e;
                uVar196 = auVar189._0_4_;
                auVar174._4_4_ = uVar196;
                auVar174._0_4_ = uVar196;
                auVar174._8_4_ = uVar196;
                auVar174._12_4_ = uVar196;
                auVar104 = vfmadd132ps_fma(auVar174,ZEXT816(0) << 0x40,local_a10);
                auVar98 = vmovshdup_avx(auVar189._0_16_);
                fVar251 = auVar98._0_4_;
                fVar300 = 1.0 - fVar251;
                fVar280 = fVar300 * fVar300 * fVar300;
                fVar273 = fVar251 * fVar251;
                fVar253 = fVar251 * fVar273;
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar280),
                                         ZEXT416((uint)fVar253));
                fVar279 = fVar251 * fVar300;
                auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar279 * 6.0)),
                                          ZEXT416((uint)(fVar300 * fVar279)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar253),
                                          ZEXT416((uint)fVar280));
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar300 * fVar279 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar251 * fVar279)));
                fVar280 = fVar280 * 0.16666667;
                fVar251 = (auVar3._0_4_ + auVar94._0_4_) * 0.16666667;
                fVar252 = (auVar95._0_4_ + auVar91._0_4_) * 0.16666667;
                fVar253 = fVar253 * 0.16666667;
                auVar217._0_4_ = fVar253 * (float)local_a00._0_4_;
                auVar217._4_4_ = fVar253 * (float)local_a00._4_4_;
                auVar217._8_4_ = fVar253 * fStack_9f8;
                auVar217._12_4_ = fVar253 * fStack_9f4;
                auVar255._4_4_ = fVar252;
                auVar255._0_4_ = fVar252;
                auVar255._8_4_ = fVar252;
                auVar255._12_4_ = fVar252;
                auVar3 = vfmadd132ps_fma(auVar255,auVar217,local_9c0._0_16_);
                auVar218._4_4_ = fVar251;
                auVar218._0_4_ = fVar251;
                auVar218._8_4_ = fVar251;
                auVar218._12_4_ = fVar251;
                auVar3 = vfmadd132ps_fma(auVar218,auVar3,local_9e0._0_16_);
                auVar199._4_4_ = fVar280;
                auVar199._0_4_ = fVar280;
                auVar199._8_4_ = fVar280;
                auVar199._12_4_ = fVar280;
                auVar3 = vfmadd132ps_fma(auVar199,auVar3,local_9a0._0_16_);
                local_860._0_16_ = auVar3;
                auVar3 = vsubps_avx(auVar104,auVar3);
                auVar104 = vdpps_avx(auVar3,auVar3,0x7f);
                local_a40._0_16_ = auVar104;
                local_a80._0_16_ = ZEXT416((uint)fVar300);
                local_7c0 = auVar189;
                if (auVar104._0_4_ < 0.0) {
                  local_aa0._0_4_ = fVar273;
                  local_ac0._0_4_ = fVar279;
                  auVar264._0_4_ = sqrtf(auVar104._0_4_);
                  auVar264._4_60_ = extraout_var;
                  auVar104 = auVar264._0_16_;
                  fVar279 = (float)local_ac0._0_4_;
                  auVar95 = local_a80._0_16_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  local_aa0._0_4_ = fVar273;
                  auVar95 = ZEXT416((uint)fVar300);
                }
                local_880._4_4_ = auVar95._0_4_;
                local_880._0_4_ = local_880._4_4_;
                fStack_878 = (float)local_880._4_4_;
                fStack_874 = (float)local_880._4_4_;
                auVar94 = vfnmsub213ss_fma(auVar98,auVar98,ZEXT416((uint)(fVar279 * 4.0)));
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar279 * 4.0)),auVar95,auVar95);
                fVar273 = (float)local_880._4_4_ * -(float)local_880._4_4_ * 0.5;
                fVar279 = auVar94._0_4_ * 0.5;
                fVar280 = auVar95._0_4_ * 0.5;
                local_aa0._0_4_ = (float)local_aa0._0_4_ * 0.5;
                auVar237._0_4_ = (float)local_aa0._0_4_ * (float)local_a00._0_4_;
                auVar237._4_4_ = (float)local_aa0._0_4_ * (float)local_a00._4_4_;
                auVar237._8_4_ = (float)local_aa0._0_4_ * fStack_9f8;
                auVar237._12_4_ = (float)local_aa0._0_4_ * fStack_9f4;
                auVar200._4_4_ = fVar280;
                auVar200._0_4_ = fVar280;
                auVar200._8_4_ = fVar280;
                auVar200._12_4_ = fVar280;
                auVar95 = vfmadd132ps_fma(auVar200,auVar237,local_9c0._0_16_);
                auVar219._4_4_ = fVar279;
                auVar219._0_4_ = fVar279;
                auVar219._8_4_ = fVar279;
                auVar219._12_4_ = fVar279;
                auVar95 = vfmadd132ps_fma(auVar219,auVar95,local_9e0._0_16_);
                auVar291._4_4_ = fVar273;
                auVar291._0_4_ = fVar273;
                auVar291._8_4_ = fVar273;
                auVar291._12_4_ = fVar273;
                _local_aa0 = vfmadd132ps_fma(auVar291,auVar95,local_9a0._0_16_);
                local_8a0._0_16_ = vdpps_avx(_local_aa0,_local_aa0,0x7f);
                auVar52._12_4_ = 0;
                auVar52._0_12_ = ZEXT812(0);
                fVar273 = local_8a0._0_4_;
                local_980._0_16_ = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar273));
                fVar279 = local_980._0_4_;
                local_8c0._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar273));
                auVar95 = vfnmadd213ss_fma(local_8c0._0_16_,local_8a0._0_16_,ZEXT416(0x40000000));
                local_8e0._0_4_ = auVar95._0_4_;
                local_ac0._0_4_ = auVar104._0_4_;
                if (fVar273 < -fVar273) {
                  fVar280 = sqrtf(fVar273);
                  auVar104 = ZEXT416((uint)local_ac0._0_4_);
                  auVar95 = _local_aa0;
                }
                else {
                  auVar95 = vsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                  fVar280 = auVar95._0_4_;
                  auVar95 = _local_aa0;
                }
                fVar251 = local_980._0_4_;
                fVar273 = fVar279 * 1.5 + fVar273 * -0.5 * fVar251 * fVar251 * fVar251;
                local_980._0_4_ = auVar95._0_4_ * fVar273;
                local_980._4_4_ = auVar95._4_4_ * fVar273;
                local_980._8_4_ = auVar95._8_4_ * fVar273;
                local_980._12_4_ = auVar95._12_4_ * fVar273;
                auVar94 = vdpps_avx(auVar3,local_980._0_16_,0x7f);
                fVar252 = auVar104._0_4_;
                fVar279 = auVar94._0_4_;
                auVar175._0_4_ = fVar279 * fVar279;
                auVar175._4_4_ = auVar94._4_4_ * auVar94._4_4_;
                auVar175._8_4_ = auVar94._8_4_ * auVar94._8_4_;
                auVar175._12_4_ = auVar94._12_4_ * auVar94._12_4_;
                auVar91 = vsubps_avx(local_a40._0_16_,auVar175);
                fVar251 = auVar91._0_4_;
                auVar201._4_12_ = ZEXT812(0) << 0x20;
                auVar201._0_4_ = fVar251;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar201);
                auVar93 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
                auVar96 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                if (fVar251 < 0.0) {
                  local_900._0_4_ = fVar280;
                  local_920._0_4_ = auVar93._0_4_;
                  local_930._4_4_ = fVar273;
                  local_930._0_4_ = fVar273;
                  fStack_928 = fVar273;
                  fStack_924 = fVar273;
                  local_910 = auVar92;
                  fVar251 = sqrtf(fVar251);
                  auVar96 = ZEXT416(auVar96._0_4_);
                  auVar93 = ZEXT416((uint)local_920._0_4_);
                  auVar104 = ZEXT416((uint)local_ac0._0_4_);
                  auVar92 = local_910;
                  auVar95 = _local_aa0;
                  fVar273 = (float)local_930._0_4_;
                  fVar253 = (float)local_930._4_4_;
                  fVar300 = fStack_928;
                  fVar301 = fStack_924;
                  fVar280 = (float)local_900._0_4_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar251 = auVar91._0_4_;
                  fVar253 = fVar273;
                  fVar300 = fVar273;
                  fVar301 = fVar273;
                }
                auVar294 = ZEXT1664(auVar95);
                auVar289 = ZEXT1664(local_a40._0_16_);
                auVar286 = ZEXT1664(auVar3);
                auVar123 = vmovdqa64_avx512vl(auVar109);
                auVar302 = ZEXT3264(auVar123);
                auVar123 = vmovdqa64_avx512vl(auVar110);
                auVar303 = ZEXT3264(auVar123);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar98);
                auVar97 = vfmadd213ss_fma(auVar98,SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_);
                auVar107 = local_7c0._0_16_;
                auVar98 = vshufps_avx(auVar107,auVar107,0x55);
                auVar220._0_4_ = auVar98._0_4_ * (float)local_a00._0_4_;
                auVar220._4_4_ = auVar98._4_4_ * (float)local_a00._4_4_;
                auVar220._8_4_ = auVar98._8_4_ * fStack_9f8;
                auVar220._12_4_ = auVar98._12_4_ * fStack_9f4;
                auVar238._0_4_ = auVar97._0_4_;
                auVar238._4_4_ = auVar238._0_4_;
                auVar238._8_4_ = auVar238._0_4_;
                auVar238._12_4_ = auVar238._0_4_;
                auVar98 = vfmadd132ps_fma(auVar238,auVar220,local_9c0._0_16_);
                auVar202._0_4_ = auVar91._0_4_;
                auVar202._4_4_ = auVar202._0_4_;
                auVar202._8_4_ = auVar202._0_4_;
                auVar202._12_4_ = auVar202._0_4_;
                auVar98 = vfmadd132ps_fma(auVar202,auVar98,local_9e0._0_16_);
                auVar98 = vfmadd132ps_fma(_local_880,auVar98,local_9a0._0_16_);
                auVar203._0_4_ = auVar98._0_4_ * (float)local_8a0._0_4_;
                auVar203._4_4_ = auVar98._4_4_ * (float)local_8a0._0_4_;
                auVar203._8_4_ = auVar98._8_4_ * (float)local_8a0._0_4_;
                auVar203._12_4_ = auVar98._12_4_ * (float)local_8a0._0_4_;
                auVar98 = vdpps_avx(auVar95,auVar98,0x7f);
                fVar215 = auVar98._0_4_;
                auVar221._0_4_ = auVar95._0_4_ * fVar215;
                auVar221._4_4_ = auVar95._4_4_ * fVar215;
                auVar221._8_4_ = auVar95._8_4_ * fVar215;
                auVar221._12_4_ = auVar95._12_4_ * fVar215;
                auVar98 = vsubps_avx(auVar203,auVar221);
                fVar215 = (float)local_8e0._0_4_ * (float)local_8c0._0_4_;
                auVar97 = vmaxss_avx(ZEXT416((uint)fVar278),
                                     ZEXT416((uint)(local_7c0._0_4_ * (float)local_a60._0_4_)));
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar105 = vxorps_avx512vl(auVar95,auVar31);
                auVar222._0_4_ = fVar273 * auVar98._0_4_ * fVar215;
                auVar222._4_4_ = fVar253 * auVar98._4_4_ * fVar215;
                auVar222._8_4_ = fVar300 * auVar98._8_4_ * fVar215;
                auVar222._12_4_ = fVar301 * auVar98._12_4_ * fVar215;
                auVar98 = vdpps_avx(auVar105,local_980._0_16_,0x7f);
                auVar91 = vfmadd213ss_fma(auVar104,ZEXT416((uint)fVar278),auVar97);
                auVar104 = vdpps_avx(auVar3,auVar222,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)(fVar252 + 1.0)),
                                           ZEXT416((uint)(fVar278 / fVar280)),auVar91);
                fVar273 = auVar98._0_4_ + auVar104._0_4_;
                auVar104 = vdpps_avx(local_a10,local_980._0_16_,0x7f);
                auVar98 = vdpps_avx(auVar3,auVar105,0x7f);
                auVar91 = vmulss_avx512f(auVar96,auVar92);
                auVar96 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar91._0_4_ *
                                                               auVar92._0_4_ * auVar92._0_4_)));
                auVar91 = vdpps_avx(auVar3,local_a10,0x7f);
                auVar93 = vfnmadd231ss_fma(auVar98,auVar94,ZEXT416((uint)fVar273));
                auVar91 = vfnmadd231ss_fma(auVar91,auVar94,auVar104);
                auVar98 = vpermilps_avx(local_860._0_16_,0xff);
                fVar251 = fVar251 - auVar98._0_4_;
                auVar92 = vshufps_avx(auVar95,auVar95,0xff);
                auVar98 = vfmsub213ss_fma(auVar93,auVar96,auVar92);
                auVar274._8_4_ = 0x80000000;
                auVar274._0_8_ = 0x8000000080000000;
                auVar274._12_4_ = 0x80000000;
                auVar277 = ZEXT1664(auVar274);
                auVar269._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
                auVar269._8_4_ = auVar98._8_4_ ^ 0x80000000;
                auVar269._12_4_ = auVar98._12_4_ ^ 0x80000000;
                auVar272 = ZEXT1664(auVar269);
                auVar91 = ZEXT416((uint)(auVar91._0_4_ * auVar96._0_4_));
                auVar93 = vfmsub231ss_fma(ZEXT416((uint)(auVar104._0_4_ * auVar98._0_4_)),
                                          ZEXT416((uint)fVar273),auVar91);
                auVar98 = vinsertps_avx(auVar269,auVar91,0x1c);
                auVar260._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                auVar260._8_4_ = auVar104._8_4_ ^ 0x80000000;
                auVar260._12_4_ = auVar104._12_4_ ^ 0x80000000;
                auVar91 = vinsertps_avx(ZEXT416((uint)fVar273),auVar260,0x10);
                auVar239._0_4_ = auVar93._0_4_;
                auVar239._4_4_ = auVar239._0_4_;
                auVar239._8_4_ = auVar239._0_4_;
                auVar239._12_4_ = auVar239._0_4_;
                auVar104 = vdivps_avx(auVar98,auVar239);
                auVar98 = vdivps_avx(auVar91,auVar239);
                auVar240._0_4_ = fVar279 * auVar104._0_4_ + fVar251 * auVar98._0_4_;
                auVar240._4_4_ = fVar279 * auVar104._4_4_ + fVar251 * auVar98._4_4_;
                auVar240._8_4_ = fVar279 * auVar104._8_4_ + fVar251 * auVar98._8_4_;
                auVar240._12_4_ = fVar279 * auVar104._12_4_ + fVar251 * auVar98._12_4_;
                auVar104 = vsubps_avx(auVar107,auVar240);
                auVar189 = ZEXT1664(auVar104);
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar98 = vandps_avx512vl(auVar94,auVar32);
              } while (auVar106._0_4_ <= auVar98._0_4_);
              auVar98 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ + auVar97._0_4_)),local_940,
                                        ZEXT416(0x36000000));
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar94 = vandps_avx512vl(ZEXT416((uint)fVar251),auVar33);
            } while (auVar98._0_4_ <= auVar94._0_4_);
            fVar273 = auVar104._0_4_ + (float)local_950._0_4_;
            if (fVar2 <= fVar273) {
              fVar278 = *(float *)(ray + k * 4 + 0x200);
              if (fVar273 <= fVar278) {
                auVar98 = vmovshdup_avx(auVar104);
                fVar279 = auVar98._0_4_;
                if ((0.0 <= fVar279) && (fVar279 <= 1.0)) {
                  auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a40._0_4_));
                  fVar280 = auVar98._0_4_;
                  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    fVar280 = fVar280 * 1.5 + local_a40._0_4_ * -0.5 * fVar280 * fVar280 * fVar280;
                    auVar241._0_4_ = auVar3._0_4_ * fVar280;
                    auVar241._4_4_ = auVar3._4_4_ * fVar280;
                    auVar241._8_4_ = auVar3._8_4_ * fVar280;
                    auVar241._12_4_ = auVar3._12_4_ * fVar280;
                    auVar92 = vfmadd213ps_fma(auVar92,auVar241,auVar95);
                    auVar98 = vshufps_avx(auVar241,auVar241,0xc9);
                    auVar94 = vshufps_avx(auVar95,auVar95,0xc9);
                    auVar242._0_4_ = auVar241._0_4_ * auVar94._0_4_;
                    auVar242._4_4_ = auVar241._4_4_ * auVar94._4_4_;
                    auVar242._8_4_ = auVar241._8_4_ * auVar94._8_4_;
                    auVar242._12_4_ = auVar241._12_4_ * auVar94._12_4_;
                    auVar91 = vfmsub231ps_fma(auVar242,auVar95,auVar98);
                    auVar98 = vshufps_avx(auVar91,auVar91,0xc9);
                    auVar94 = vshufps_avx(auVar92,auVar92,0xc9);
                    auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                    auVar176._0_4_ = auVar92._0_4_ * auVar91._0_4_;
                    auVar176._4_4_ = auVar92._4_4_ * auVar91._4_4_;
                    auVar176._8_4_ = auVar92._8_4_ * auVar91._8_4_;
                    auVar176._12_4_ = auVar92._12_4_ * auVar91._12_4_;
                    auVar98 = vfmsub231ps_fma(auVar176,auVar98,auVar94);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar273;
                      uVar196 = vextractps_avx(auVar98,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar196;
                      uVar196 = vextractps_avx(auVar98,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar196;
                      *(int *)(ray + k * 4 + 0x380) = auVar98._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar279;
                      *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                      *(int *)(ray + k * 4 + 0x440) = (int)local_a48;
                      *(uint *)(ray + k * 4 + 0x480) = uVar4;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar9 = context->user;
                      auVar162 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar162,auVar189);
                      auVar162 = vpermps_avx512f(auVar162,ZEXT1664(auVar98));
                      auVar264 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar264,ZEXT1664(auVar98));
                      local_380 = vbroadcastss_avx512f(auVar98);
                      local_400[0] = (RTCHitN)auVar162[0];
                      local_400[1] = (RTCHitN)auVar162[1];
                      local_400[2] = (RTCHitN)auVar162[2];
                      local_400[3] = (RTCHitN)auVar162[3];
                      local_400[4] = (RTCHitN)auVar162[4];
                      local_400[5] = (RTCHitN)auVar162[5];
                      local_400[6] = (RTCHitN)auVar162[6];
                      local_400[7] = (RTCHitN)auVar162[7];
                      local_400[8] = (RTCHitN)auVar162[8];
                      local_400[9] = (RTCHitN)auVar162[9];
                      local_400[10] = (RTCHitN)auVar162[10];
                      local_400[0xb] = (RTCHitN)auVar162[0xb];
                      local_400[0xc] = (RTCHitN)auVar162[0xc];
                      local_400[0xd] = (RTCHitN)auVar162[0xd];
                      local_400[0xe] = (RTCHitN)auVar162[0xe];
                      local_400[0xf] = (RTCHitN)auVar162[0xf];
                      local_400[0x10] = (RTCHitN)auVar162[0x10];
                      local_400[0x11] = (RTCHitN)auVar162[0x11];
                      local_400[0x12] = (RTCHitN)auVar162[0x12];
                      local_400[0x13] = (RTCHitN)auVar162[0x13];
                      local_400[0x14] = (RTCHitN)auVar162[0x14];
                      local_400[0x15] = (RTCHitN)auVar162[0x15];
                      local_400[0x16] = (RTCHitN)auVar162[0x16];
                      local_400[0x17] = (RTCHitN)auVar162[0x17];
                      local_400[0x18] = (RTCHitN)auVar162[0x18];
                      local_400[0x19] = (RTCHitN)auVar162[0x19];
                      local_400[0x1a] = (RTCHitN)auVar162[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar162[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar162[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar162[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar162[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar162[0x1f];
                      local_400[0x20] = (RTCHitN)auVar162[0x20];
                      local_400[0x21] = (RTCHitN)auVar162[0x21];
                      local_400[0x22] = (RTCHitN)auVar162[0x22];
                      local_400[0x23] = (RTCHitN)auVar162[0x23];
                      local_400[0x24] = (RTCHitN)auVar162[0x24];
                      local_400[0x25] = (RTCHitN)auVar162[0x25];
                      local_400[0x26] = (RTCHitN)auVar162[0x26];
                      local_400[0x27] = (RTCHitN)auVar162[0x27];
                      local_400[0x28] = (RTCHitN)auVar162[0x28];
                      local_400[0x29] = (RTCHitN)auVar162[0x29];
                      local_400[0x2a] = (RTCHitN)auVar162[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar162[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar162[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar162[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar162[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar162[0x2f];
                      local_400[0x30] = (RTCHitN)auVar162[0x30];
                      local_400[0x31] = (RTCHitN)auVar162[0x31];
                      local_400[0x32] = (RTCHitN)auVar162[0x32];
                      local_400[0x33] = (RTCHitN)auVar162[0x33];
                      local_400[0x34] = (RTCHitN)auVar162[0x34];
                      local_400[0x35] = (RTCHitN)auVar162[0x35];
                      local_400[0x36] = (RTCHitN)auVar162[0x36];
                      local_400[0x37] = (RTCHitN)auVar162[0x37];
                      local_400[0x38] = (RTCHitN)auVar162[0x38];
                      local_400[0x39] = (RTCHitN)auVar162[0x39];
                      local_400[0x3a] = (RTCHitN)auVar162[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar162[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar162[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar162[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar162[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar162[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar162 = vmovdqa64_avx512f(local_440);
                      local_280 = vmovdqa64_avx512f(auVar162);
                      auVar123 = vpcmpeqd_avx2(auVar162._0_32_,auVar162._0_32_);
                      local_a50[3] = auVar123;
                      local_a50[2] = auVar123;
                      local_a50[1] = auVar123;
                      *local_a50 = auVar123;
                      local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar273;
                      auVar162 = vmovdqa64_avx512f(local_4c0);
                      local_780 = vmovdqa64_avx512f(auVar162);
                      local_af0.valid = (int *)local_780;
                      local_af0.geometryUserPtr = pGVar5->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = local_400;
                      local_af0.N = 0x10;
                      local_af0.ray = (RTCRayN *)ray;
                      if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar272 = ZEXT1664(auVar269);
                        auVar277 = ZEXT1664(auVar274);
                        auVar189 = ZEXT1664(auVar104);
                        auVar286 = ZEXT1664(auVar3);
                        auVar289 = ZEXT1664(local_a40._0_16_);
                        auVar294 = ZEXT1664(auVar95);
                        (*pGVar5->intersectionFilterN)(&local_af0);
                        auVar123 = vmovdqa64_avx512vl(auVar110);
                        auVar303 = ZEXT3264(auVar123);
                        auVar123 = vmovdqa64_avx512vl(auVar109);
                        auVar302 = ZEXT3264(auVar123);
                        auVar162 = vmovdqa64_avx512f(local_780);
                      }
                      uVar26 = vptestmd_avx512f(auVar162,auVar162);
                      if ((short)uVar26 != 0) {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar272 = ZEXT1664(auVar272._0_16_);
                          auVar277 = ZEXT1664(auVar277._0_16_);
                          auVar189 = ZEXT1664(auVar189._0_16_);
                          auVar286 = ZEXT1664(auVar286._0_16_);
                          auVar289 = ZEXT1664(auVar289._0_16_);
                          auVar294 = ZEXT1664(auVar294._0_16_);
                          (*p_Var10)(&local_af0);
                          auVar123 = vmovdqa64_avx512vl(auVar110);
                          auVar303 = ZEXT3264(auVar123);
                          auVar123 = vmovdqa64_avx512vl(auVar109);
                          auVar302 = ZEXT3264(auVar123);
                          auVar162 = vmovdqa64_avx512f(local_780);
                        }
                        uVar83 = vptestmd_avx512f(auVar162,auVar162);
                        if ((short)uVar83 != 0) {
                          iVar54 = *(int *)(local_af0.hit + 4);
                          iVar55 = *(int *)(local_af0.hit + 8);
                          iVar56 = *(int *)(local_af0.hit + 0xc);
                          iVar57 = *(int *)(local_af0.hit + 0x10);
                          iVar58 = *(int *)(local_af0.hit + 0x14);
                          iVar59 = *(int *)(local_af0.hit + 0x18);
                          iVar60 = *(int *)(local_af0.hit + 0x1c);
                          iVar61 = *(int *)(local_af0.hit + 0x20);
                          iVar62 = *(int *)(local_af0.hit + 0x24);
                          iVar63 = *(int *)(local_af0.hit + 0x28);
                          iVar64 = *(int *)(local_af0.hit + 0x2c);
                          iVar65 = *(int *)(local_af0.hit + 0x30);
                          iVar66 = *(int *)(local_af0.hit + 0x34);
                          iVar67 = *(int *)(local_af0.hit + 0x38);
                          iVar68 = *(int *)(local_af0.hit + 0x3c);
                          bVar75 = (byte)uVar83;
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar74 = (byte)(uVar83 >> 8);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x300) =
                               (uint)(bVar75 & 1) * *(int *)local_af0.hit |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x300);
                          *(uint *)(local_af0.ray + 0x304) =
                               (uint)bVar82 * iVar54 |
                               (uint)!bVar82 * *(int *)(local_af0.ray + 0x304);
                          *(uint *)(local_af0.ray + 0x308) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x308);
                          *(uint *)(local_af0.ray + 0x30c) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x30c);
                          *(uint *)(local_af0.ray + 0x310) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x310);
                          *(uint *)(local_af0.ray + 0x314) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x314);
                          *(uint *)(local_af0.ray + 0x318) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x318);
                          *(uint *)(local_af0.ray + 0x31c) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x31c);
                          *(uint *)(local_af0.ray + 800) =
                               (uint)(bVar74 & 1) * iVar61 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 800);
                          *(uint *)(local_af0.ray + 0x324) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x324);
                          *(uint *)(local_af0.ray + 0x328) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x328);
                          *(uint *)(local_af0.ray + 0x32c) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x32c);
                          *(uint *)(local_af0.ray + 0x330) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x330);
                          *(uint *)(local_af0.ray + 0x334) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x334);
                          *(uint *)(local_af0.ray + 0x338) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x338);
                          *(uint *)(local_af0.ray + 0x33c) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x33c);
                          iVar54 = *(int *)(local_af0.hit + 0x44);
                          iVar55 = *(int *)(local_af0.hit + 0x48);
                          iVar56 = *(int *)(local_af0.hit + 0x4c);
                          iVar57 = *(int *)(local_af0.hit + 0x50);
                          iVar58 = *(int *)(local_af0.hit + 0x54);
                          iVar59 = *(int *)(local_af0.hit + 0x58);
                          iVar60 = *(int *)(local_af0.hit + 0x5c);
                          iVar61 = *(int *)(local_af0.hit + 0x60);
                          iVar62 = *(int *)(local_af0.hit + 100);
                          iVar63 = *(int *)(local_af0.hit + 0x68);
                          iVar64 = *(int *)(local_af0.hit + 0x6c);
                          iVar65 = *(int *)(local_af0.hit + 0x70);
                          iVar66 = *(int *)(local_af0.hit + 0x74);
                          iVar67 = *(int *)(local_af0.hit + 0x78);
                          iVar68 = *(int *)(local_af0.hit + 0x7c);
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x340) =
                               (uint)(bVar75 & 1) * *(int *)(local_af0.hit + 0x40) |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x340);
                          *(uint *)(local_af0.ray + 0x344) =
                               (uint)bVar82 * iVar54 |
                               (uint)!bVar82 * *(int *)(local_af0.ray + 0x344);
                          *(uint *)(local_af0.ray + 0x348) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x348);
                          *(uint *)(local_af0.ray + 0x34c) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x34c);
                          *(uint *)(local_af0.ray + 0x350) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x350);
                          *(uint *)(local_af0.ray + 0x354) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x354);
                          *(uint *)(local_af0.ray + 0x358) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x358);
                          *(uint *)(local_af0.ray + 0x35c) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x35c);
                          *(uint *)(local_af0.ray + 0x360) =
                               (uint)(bVar74 & 1) * iVar61 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x360);
                          *(uint *)(local_af0.ray + 0x364) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x364);
                          *(uint *)(local_af0.ray + 0x368) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x368);
                          *(uint *)(local_af0.ray + 0x36c) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x36c);
                          *(uint *)(local_af0.ray + 0x370) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x370);
                          *(uint *)(local_af0.ray + 0x374) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x374);
                          *(uint *)(local_af0.ray + 0x378) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x378);
                          *(uint *)(local_af0.ray + 0x37c) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x37c);
                          iVar54 = *(int *)(local_af0.hit + 0x84);
                          iVar55 = *(int *)(local_af0.hit + 0x88);
                          iVar56 = *(int *)(local_af0.hit + 0x8c);
                          iVar57 = *(int *)(local_af0.hit + 0x90);
                          iVar58 = *(int *)(local_af0.hit + 0x94);
                          iVar59 = *(int *)(local_af0.hit + 0x98);
                          iVar60 = *(int *)(local_af0.hit + 0x9c);
                          iVar61 = *(int *)(local_af0.hit + 0xa0);
                          iVar62 = *(int *)(local_af0.hit + 0xa4);
                          iVar63 = *(int *)(local_af0.hit + 0xa8);
                          iVar64 = *(int *)(local_af0.hit + 0xac);
                          iVar65 = *(int *)(local_af0.hit + 0xb0);
                          iVar66 = *(int *)(local_af0.hit + 0xb4);
                          iVar67 = *(int *)(local_af0.hit + 0xb8);
                          iVar68 = *(int *)(local_af0.hit + 0xbc);
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x380) =
                               (uint)(bVar75 & 1) * *(int *)(local_af0.hit + 0x80) |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x380);
                          *(uint *)(local_af0.ray + 900) =
                               (uint)bVar82 * iVar54 | (uint)!bVar82 * *(int *)(local_af0.ray + 900)
                          ;
                          *(uint *)(local_af0.ray + 0x388) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x388);
                          *(uint *)(local_af0.ray + 0x38c) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x38c);
                          *(uint *)(local_af0.ray + 0x390) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x390);
                          *(uint *)(local_af0.ray + 0x394) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x394);
                          *(uint *)(local_af0.ray + 0x398) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x398);
                          *(uint *)(local_af0.ray + 0x39c) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x39c);
                          *(uint *)(local_af0.ray + 0x3a0) =
                               (uint)(bVar74 & 1) * iVar61 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x3a0);
                          *(uint *)(local_af0.ray + 0x3a4) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x3a4);
                          *(uint *)(local_af0.ray + 0x3a8) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x3a8);
                          *(uint *)(local_af0.ray + 0x3ac) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x3ac);
                          *(uint *)(local_af0.ray + 0x3b0) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x3b0);
                          *(uint *)(local_af0.ray + 0x3b4) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x3b4);
                          *(uint *)(local_af0.ray + 0x3b8) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x3b8);
                          *(uint *)(local_af0.ray + 0x3bc) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x3bc);
                          iVar54 = *(int *)(local_af0.hit + 0xc4);
                          iVar55 = *(int *)(local_af0.hit + 200);
                          iVar56 = *(int *)(local_af0.hit + 0xcc);
                          iVar57 = *(int *)(local_af0.hit + 0xd0);
                          iVar58 = *(int *)(local_af0.hit + 0xd4);
                          iVar59 = *(int *)(local_af0.hit + 0xd8);
                          iVar60 = *(int *)(local_af0.hit + 0xdc);
                          iVar61 = *(int *)(local_af0.hit + 0xe0);
                          iVar62 = *(int *)(local_af0.hit + 0xe4);
                          iVar63 = *(int *)(local_af0.hit + 0xe8);
                          iVar64 = *(int *)(local_af0.hit + 0xec);
                          iVar65 = *(int *)(local_af0.hit + 0xf0);
                          iVar66 = *(int *)(local_af0.hit + 0xf4);
                          iVar67 = *(int *)(local_af0.hit + 0xf8);
                          iVar68 = *(int *)(local_af0.hit + 0xfc);
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x3c0) =
                               (uint)(bVar75 & 1) * *(int *)(local_af0.hit + 0xc0) |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x3c0);
                          *(uint *)(local_af0.ray + 0x3c4) =
                               (uint)bVar82 * iVar54 |
                               (uint)!bVar82 * *(int *)(local_af0.ray + 0x3c4);
                          *(uint *)(local_af0.ray + 0x3c8) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x3c8);
                          *(uint *)(local_af0.ray + 0x3cc) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x3cc);
                          *(uint *)(local_af0.ray + 0x3d0) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x3d0);
                          *(uint *)(local_af0.ray + 0x3d4) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x3d4);
                          *(uint *)(local_af0.ray + 0x3d8) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x3d8);
                          *(uint *)(local_af0.ray + 0x3dc) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x3dc);
                          *(uint *)(local_af0.ray + 0x3e0) =
                               (uint)(bVar74 & 1) * iVar61 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x3e0);
                          *(uint *)(local_af0.ray + 0x3e4) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x3e4);
                          *(uint *)(local_af0.ray + 1000) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 1000);
                          *(uint *)(local_af0.ray + 0x3ec) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x3ec);
                          *(uint *)(local_af0.ray + 0x3f0) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x3f0);
                          *(uint *)(local_af0.ray + 0x3f4) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x3f4);
                          *(uint *)(local_af0.ray + 0x3f8) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x3f8);
                          *(uint *)(local_af0.ray + 0x3fc) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x3fc);
                          iVar54 = *(int *)(local_af0.hit + 0x104);
                          iVar55 = *(int *)(local_af0.hit + 0x108);
                          iVar56 = *(int *)(local_af0.hit + 0x10c);
                          iVar57 = *(int *)(local_af0.hit + 0x110);
                          iVar58 = *(int *)(local_af0.hit + 0x114);
                          iVar59 = *(int *)(local_af0.hit + 0x118);
                          iVar60 = *(int *)(local_af0.hit + 0x11c);
                          iVar61 = *(int *)(local_af0.hit + 0x120);
                          iVar62 = *(int *)(local_af0.hit + 0x124);
                          iVar63 = *(int *)(local_af0.hit + 0x128);
                          iVar64 = *(int *)(local_af0.hit + 300);
                          iVar65 = *(int *)(local_af0.hit + 0x130);
                          iVar66 = *(int *)(local_af0.hit + 0x134);
                          iVar67 = *(int *)(local_af0.hit + 0x138);
                          iVar68 = *(int *)(local_af0.hit + 0x13c);
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x400) =
                               (uint)(bVar75 & 1) * *(int *)(local_af0.hit + 0x100) |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x400);
                          *(uint *)(local_af0.ray + 0x404) =
                               (uint)bVar82 * iVar54 |
                               (uint)!bVar82 * *(int *)(local_af0.ray + 0x404);
                          *(uint *)(local_af0.ray + 0x408) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x408);
                          *(uint *)(local_af0.ray + 0x40c) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x40c);
                          *(uint *)(local_af0.ray + 0x410) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x410);
                          *(uint *)(local_af0.ray + 0x414) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x414);
                          *(uint *)(local_af0.ray + 0x418) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x418);
                          *(uint *)(local_af0.ray + 0x41c) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x41c);
                          *(uint *)(local_af0.ray + 0x420) =
                               (uint)(bVar74 & 1) * iVar61 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x420);
                          *(uint *)(local_af0.ray + 0x424) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x424);
                          *(uint *)(local_af0.ray + 0x428) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x428);
                          *(uint *)(local_af0.ray + 0x42c) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x42c);
                          *(uint *)(local_af0.ray + 0x430) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x430);
                          *(uint *)(local_af0.ray + 0x434) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x434);
                          *(uint *)(local_af0.ray + 0x438) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x438);
                          *(uint *)(local_af0.ray + 0x43c) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x43c);
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x140)
                                                      );
                          auVar162 = vmovdqu32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_af0.ray + 0x440) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x180)
                                                      );
                          auVar162 = vmovdqu32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_af0.ray + 0x480) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x1c0)
                                                      );
                          auVar162 = vmovdqa32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_af0.ray + 0x4c0) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x200)
                                                      );
                          auVar162 = vmovdqa32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_af0.ray + 0x500) = auVar162;
                          goto LAB_018dc67e;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar278;
                    }
                  }
                }
              }
            }
LAB_018dc67e:
            uVar196 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar262._4_4_ = uVar196;
            auVar262._0_4_ = uVar196;
            auVar262._8_4_ = uVar196;
            auVar262._12_4_ = uVar196;
            auVar262._16_4_ = uVar196;
            auVar262._20_4_ = uVar196;
            auVar262._24_4_ = uVar196;
            auVar262._28_4_ = uVar196;
            auVar162 = ZEXT3264(auVar262);
            auVar69._4_4_ = fStack_6fc;
            auVar69._0_4_ = local_700;
            auVar69._8_4_ = fStack_6f8;
            auVar69._12_4_ = fStack_6f4;
            auVar69._16_4_ = fStack_6f0;
            auVar69._20_4_ = fStack_6ec;
            auVar69._24_4_ = fStack_6e8;
            auVar69._28_4_ = fStack_6e4;
            uVar26 = vcmpps_avx512vl(auVar262,auVar69,0xd);
            bVar79 = ~('\x01' << ((byte)iVar30 & 0x1f)) & bVar79 & (byte)uVar26;
          }
          auVar185._0_4_ = (float)local_7e0._0_4_ + (float)local_720._0_4_;
          auVar185._4_4_ = (float)local_7e0._4_4_ + (float)local_720._4_4_;
          auVar185._8_4_ = fStack_7d8 + fStack_718;
          auVar185._12_4_ = fStack_7d4 + fStack_714;
          auVar185._16_4_ = fStack_7d0 + fStack_710;
          auVar185._20_4_ = fStack_7cc + fStack_70c;
          auVar185._24_4_ = fStack_7c8 + fStack_708;
          auVar185._28_4_ = fStack_7c4 + fStack_704;
          uVar196 = auVar162._0_4_;
          auVar210._4_4_ = uVar196;
          auVar210._0_4_ = uVar196;
          auVar210._8_4_ = uVar196;
          auVar210._12_4_ = uVar196;
          auVar210._16_4_ = uVar196;
          auVar210._20_4_ = uVar196;
          auVar210._24_4_ = uVar196;
          auVar210._28_4_ = uVar196;
          uVar26 = vcmpps_avx512vl(auVar185,auVar210,2);
          auVar186._8_4_ = 2;
          auVar186._0_8_ = 0x200000002;
          auVar186._12_4_ = 2;
          auVar186._16_4_ = 2;
          auVar186._20_4_ = 2;
          auVar186._24_4_ = 2;
          auVar186._28_4_ = 2;
          auVar40._8_4_ = 3;
          auVar40._0_8_ = 0x300000003;
          auVar40._12_4_ = 3;
          auVar40._16_4_ = 3;
          auVar40._20_4_ = 3;
          auVar40._24_4_ = 3;
          auVar40._28_4_ = 3;
          auVar123 = vpblendmd_avx512vl(auVar186,auVar40);
          local_720._0_4_ = (uint)(bVar73 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar82 = (bool)(bVar73 >> 1 & 1);
          local_720._4_4_ = (uint)bVar82 * auVar123._4_4_ | (uint)!bVar82 * 2;
          bVar82 = (bool)(bVar73 >> 2 & 1);
          fStack_718 = (float)((uint)bVar82 * auVar123._8_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar73 >> 3 & 1);
          fStack_714 = (float)((uint)bVar82 * auVar123._12_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar73 >> 4 & 1);
          fStack_710 = (float)((uint)bVar82 * auVar123._16_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar73 >> 5 & 1);
          fStack_70c = (float)((uint)bVar82 * auVar123._20_4_ | (uint)!bVar82 * 2);
          bVar82 = (bool)(bVar73 >> 6 & 1);
          fStack_708 = (float)((uint)bVar82 * auVar123._24_4_ | (uint)!bVar82 * 2);
          fStack_704 = (float)((uint)(bVar73 >> 7) * auVar123._28_4_ |
                              (uint)!(bool)(bVar73 >> 7) * 2);
          bVar72 = (byte)uVar28 & bVar72 & (byte)uVar26;
          uVar26 = vpcmpd_avx512vl(_local_720,local_6c0,2);
          bVar79 = (byte)uVar26 & bVar72;
          local_800 = _local_680;
          local_700 = (float)local_7e0._0_4_ + (float)local_680._0_4_;
          fStack_6fc = (float)local_7e0._4_4_ + (float)local_680._4_4_;
          fStack_6f8 = fStack_7d8 + fStack_678;
          fStack_6f4 = fStack_7d4 + fStack_674;
          fStack_6f0 = fStack_7d0 + fStack_670;
          fStack_6ec = fStack_7cc + fStack_66c;
          fStack_6e8 = fStack_7c8 + fStack_668;
          fStack_6e4 = fStack_7c4 + fStack_664;
          while( true ) {
            if (bVar79 == 0) break;
            auVar187._8_4_ = 0x7f800000;
            auVar187._0_8_ = 0x7f8000007f800000;
            auVar187._12_4_ = 0x7f800000;
            auVar187._16_4_ = 0x7f800000;
            auVar187._20_4_ = 0x7f800000;
            auVar187._24_4_ = 0x7f800000;
            auVar187._28_4_ = 0x7f800000;
            auVar123 = vblendmps_avx512vl(auVar187,local_800);
            auVar159._0_4_ =
                 (uint)(bVar79 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 1 & 1);
            auVar159._4_4_ = (uint)bVar82 * auVar123._4_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 2 & 1);
            auVar159._8_4_ = (uint)bVar82 * auVar123._8_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 3 & 1);
            auVar159._12_4_ = (uint)bVar82 * auVar123._12_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 4 & 1);
            auVar159._16_4_ = (uint)bVar82 * auVar123._16_4_ | (uint)!bVar82 * 0x7f800000;
            bVar82 = (bool)(bVar79 >> 5 & 1);
            auVar159._20_4_ = (uint)bVar82 * auVar123._20_4_ | (uint)!bVar82 * 0x7f800000;
            auVar159._24_4_ =
                 (uint)(bVar79 >> 6) * auVar123._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar123 = vshufps_avx(auVar159,auVar159,0xb1);
            auVar123 = vminps_avx(auVar159,auVar123);
            auVar120 = vshufpd_avx(auVar123,auVar123,5);
            auVar123 = vminps_avx(auVar123,auVar120);
            auVar120 = vpermpd_avx2(auVar123,0x4e);
            auVar123 = vminps_avx(auVar123,auVar120);
            uVar26 = vcmpps_avx512vl(auVar159,auVar123,0);
            bVar75 = (byte)uVar26 & bVar79;
            bVar73 = bVar79;
            if (bVar75 != 0) {
              bVar73 = bVar75;
            }
            iVar30 = 0;
            for (uVar84 = (uint)bVar73; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar30 = iVar30 + 1;
            }
            uVar84 = *(uint *)(local_660 + (uint)(iVar30 << 2));
            fVar273 = auVar103._0_4_;
            auVar104 = ZEXT416(*(uint *)(local_500 + (uint)(iVar30 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_500 + (uint)(iVar30 << 2)));
              auVar277 = ZEXT1664(auVar277._0_16_);
              auVar286 = ZEXT1664(auVar286._0_16_);
              auVar289 = ZEXT1664(auVar289._0_16_);
              auVar294 = ZEXT1664(auVar294._0_16_);
              fVar273 = sqrtf((float)local_a20._0_4_);
              auVar123 = vmovdqa64_avx512vl(auVar110);
              auVar303 = ZEXT3264(auVar123);
              auVar123 = vmovdqa64_avx512vl(auVar109);
              auVar302 = ZEXT3264(auVar123);
              auVar104 = local_a80._0_16_;
            }
            auVar272 = ZEXT464(uVar84);
            auVar3 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
            auVar98 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
            auVar95 = vminps_avx(local_9c0._0_16_,local_a00._0_16_);
            auVar94 = vminps_avx(auVar3,auVar95);
            auVar3 = vmaxps_avx(local_9c0._0_16_,local_a00._0_16_);
            auVar95 = vmaxps_avx(auVar98,auVar3);
            auVar243._8_4_ = 0x7fffffff;
            auVar243._0_8_ = 0x7fffffff7fffffff;
            auVar243._12_4_ = 0x7fffffff;
            auVar98 = vandps_avx(auVar94,auVar243);
            auVar3 = vandps_avx(auVar95,auVar243);
            auVar98 = vmaxps_avx(auVar98,auVar3);
            auVar3 = vmovshdup_avx(auVar98);
            auVar3 = vmaxss_avx(auVar3,auVar98);
            auVar98 = vshufpd_avx(auVar98,auVar98,1);
            auVar98 = vmaxss_avx(auVar98,auVar3);
            local_980._0_4_ = auVar98._0_4_ * 1.9073486e-06;
            local_940 = vshufps_avx(auVar95,auVar95,0xff);
            auVar104 = vinsertps_avx(ZEXT416(uVar84),auVar104,0x10);
            auVar189 = ZEXT1664(auVar104);
            lVar76 = 5;
            do {
              do {
                bVar82 = lVar76 == 0;
                lVar76 = lVar76 + -1;
                if (bVar82) goto LAB_018dd3a5;
                uVar196 = auVar189._0_4_;
                auVar177._4_4_ = uVar196;
                auVar177._0_4_ = uVar196;
                auVar177._8_4_ = uVar196;
                auVar177._12_4_ = uVar196;
                auVar104 = vfmadd132ps_fma(auVar177,ZEXT816(0) << 0x40,local_a10);
                auVar98 = vmovshdup_avx(auVar189._0_16_);
                fVar251 = auVar98._0_4_;
                fVar300 = 1.0 - fVar251;
                fVar280 = fVar300 * fVar300 * fVar300;
                fVar278 = fVar251 * fVar251;
                fVar253 = fVar251 * fVar278;
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar280),
                                         ZEXT416((uint)fVar253));
                fVar279 = fVar251 * fVar300;
                auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar279 * 6.0)),
                                          ZEXT416((uint)(fVar300 * fVar279)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar253),
                                          ZEXT416((uint)fVar280));
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar300 * fVar279 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar251 * fVar279)));
                fVar280 = fVar280 * 0.16666667;
                fVar251 = (auVar3._0_4_ + auVar94._0_4_) * 0.16666667;
                fVar252 = (auVar95._0_4_ + auVar91._0_4_) * 0.16666667;
                fVar253 = fVar253 * 0.16666667;
                auVar223._0_4_ = fVar253 * (float)local_a00._0_4_;
                auVar223._4_4_ = fVar253 * (float)local_a00._4_4_;
                auVar223._8_4_ = fVar253 * fStack_9f8;
                auVar223._12_4_ = fVar253 * fStack_9f4;
                auVar256._4_4_ = fVar252;
                auVar256._0_4_ = fVar252;
                auVar256._8_4_ = fVar252;
                auVar256._12_4_ = fVar252;
                auVar3 = vfmadd132ps_fma(auVar256,auVar223,local_9c0._0_16_);
                auVar224._4_4_ = fVar251;
                auVar224._0_4_ = fVar251;
                auVar224._8_4_ = fVar251;
                auVar224._12_4_ = fVar251;
                auVar3 = vfmadd132ps_fma(auVar224,auVar3,local_9e0._0_16_);
                auVar204._4_4_ = fVar280;
                auVar204._0_4_ = fVar280;
                auVar204._8_4_ = fVar280;
                auVar204._12_4_ = fVar280;
                auVar3 = vfmadd132ps_fma(auVar204,auVar3,local_9a0._0_16_);
                local_860._0_16_ = auVar3;
                auVar3 = vsubps_avx(auVar104,auVar3);
                auVar104 = vdpps_avx(auVar3,auVar3,0x7f);
                local_a40._0_16_ = auVar104;
                local_a80._0_16_ = ZEXT416((uint)fVar300);
                local_7c0 = auVar189;
                if (auVar104._0_4_ < 0.0) {
                  local_aa0._0_4_ = fVar278;
                  local_ac0._0_4_ = fVar279;
                  auVar189._0_4_ = sqrtf(auVar104._0_4_);
                  auVar189._4_60_ = extraout_var_00;
                  auVar104 = auVar189._0_16_;
                  fVar279 = (float)local_ac0._0_4_;
                  auVar95 = local_a80._0_16_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  local_aa0._0_4_ = fVar278;
                  auVar95 = ZEXT416((uint)fVar300);
                }
                local_880._4_4_ = auVar95._0_4_;
                local_880._0_4_ = local_880._4_4_;
                fStack_878 = (float)local_880._4_4_;
                fStack_874 = (float)local_880._4_4_;
                auVar94 = vfnmsub213ss_fma(auVar98,auVar98,ZEXT416((uint)(fVar279 * 4.0)));
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar279 * 4.0)),auVar95,auVar95);
                fVar278 = (float)local_880._4_4_ * -(float)local_880._4_4_ * 0.5;
                fVar279 = auVar94._0_4_ * 0.5;
                fVar280 = auVar95._0_4_ * 0.5;
                local_aa0._0_4_ = (float)local_aa0._0_4_ * 0.5;
                auVar244._0_4_ = (float)local_aa0._0_4_ * (float)local_a00._0_4_;
                auVar244._4_4_ = (float)local_aa0._0_4_ * (float)local_a00._4_4_;
                auVar244._8_4_ = (float)local_aa0._0_4_ * fStack_9f8;
                auVar244._12_4_ = (float)local_aa0._0_4_ * fStack_9f4;
                auVar205._4_4_ = fVar280;
                auVar205._0_4_ = fVar280;
                auVar205._8_4_ = fVar280;
                auVar205._12_4_ = fVar280;
                auVar95 = vfmadd132ps_fma(auVar205,auVar244,local_9c0._0_16_);
                auVar225._4_4_ = fVar279;
                auVar225._0_4_ = fVar279;
                auVar225._8_4_ = fVar279;
                auVar225._12_4_ = fVar279;
                auVar95 = vfmadd132ps_fma(auVar225,auVar95,local_9e0._0_16_);
                auVar292._4_4_ = fVar278;
                auVar292._0_4_ = fVar278;
                auVar292._8_4_ = fVar278;
                auVar292._12_4_ = fVar278;
                _local_aa0 = vfmadd132ps_fma(auVar292,auVar95,local_9a0._0_16_);
                local_8a0._0_16_ = vdpps_avx(_local_aa0,_local_aa0,0x7f);
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                fVar278 = local_8a0._0_4_;
                auVar94 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar278));
                local_8c0._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar278));
                auVar95 = vfnmadd213ss_fma(local_8c0._0_16_,local_8a0._0_16_,ZEXT416(0x40000000));
                local_8e0._0_4_ = auVar95._0_4_;
                local_ac0._0_4_ = auVar104._0_4_;
                if (fVar278 < -fVar278) {
                  local_a60 = auVar94;
                  fVar279 = sqrtf(fVar278);
                  auVar104 = ZEXT416((uint)local_ac0._0_4_);
                  auVar95 = local_a60;
                  auVar91 = _local_aa0;
                }
                else {
                  auVar95 = vsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                  fVar279 = auVar95._0_4_;
                  auVar95 = auVar94;
                  auVar91 = _local_aa0;
                }
                fVar280 = auVar95._0_4_;
                auVar96 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar94._0_4_ * 1.5 +
                                                   fVar278 * -0.5 * fVar280 * fVar280 * fVar280)));
                auVar93 = vmulps_avx512vl(auVar91,auVar96);
                auVar95 = vdpps_avx(auVar3,auVar93,0x7f);
                fVar278 = auVar104._0_4_ + 1.0;
                fVar280 = auVar95._0_4_;
                auVar178._0_4_ = fVar280 * fVar280;
                auVar178._4_4_ = auVar95._4_4_ * auVar95._4_4_;
                auVar178._8_4_ = auVar95._8_4_ * auVar95._8_4_;
                auVar178._12_4_ = auVar95._12_4_ * auVar95._12_4_;
                auVar94 = vsubps_avx(local_a40._0_16_,auVar178);
                fVar251 = auVar94._0_4_;
                auVar206._4_12_ = ZEXT812(0) << 0x20;
                auVar206._0_4_ = fVar251;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar206);
                auVar97 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
                auVar106 = vmulss_avx512f(auVar94,ZEXT416(0xbf000000));
                if (fVar251 < 0.0) {
                  local_a60._0_4_ = fVar278;
                  local_910._0_4_ = auVar97._0_4_;
                  _local_930 = auVar96;
                  local_920 = auVar93;
                  local_900 = auVar92;
                  fVar251 = sqrtf(fVar251);
                  auVar106 = ZEXT416(auVar106._0_4_);
                  auVar97 = ZEXT416((uint)local_910._0_4_);
                  auVar104 = ZEXT416((uint)local_ac0._0_4_);
                  auVar92 = local_900;
                  auVar91 = _local_aa0;
                  fVar278 = (float)local_a60._0_4_;
                  auVar93 = local_920;
                  auVar96 = _local_930;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  fVar251 = auVar94._0_4_;
                }
                auVar294 = ZEXT1664(auVar91);
                auVar289 = ZEXT1664(local_a40._0_16_);
                auVar286 = ZEXT1664(auVar3);
                auVar123 = vmovdqa64_avx512vl(auVar109);
                auVar302 = ZEXT3264(auVar123);
                auVar123 = vmovdqa64_avx512vl(auVar110);
                auVar303 = ZEXT3264(auVar123);
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar98);
                auVar105 = vfmadd213ss_fma(auVar98,SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_);
                auVar283 = local_7c0._0_16_;
                auVar98 = vshufps_avx(auVar283,auVar283,0x55);
                auVar226._0_4_ = auVar98._0_4_ * (float)local_a00._0_4_;
                auVar226._4_4_ = auVar98._4_4_ * (float)local_a00._4_4_;
                auVar226._8_4_ = auVar98._8_4_ * fStack_9f8;
                auVar226._12_4_ = auVar98._12_4_ * fStack_9f4;
                auVar245._0_4_ = auVar105._0_4_;
                auVar245._4_4_ = auVar245._0_4_;
                auVar245._8_4_ = auVar245._0_4_;
                auVar245._12_4_ = auVar245._0_4_;
                auVar98 = vfmadd132ps_fma(auVar245,auVar226,local_9c0._0_16_);
                auVar207._0_4_ = auVar94._0_4_;
                auVar207._4_4_ = auVar207._0_4_;
                auVar207._8_4_ = auVar207._0_4_;
                auVar207._12_4_ = auVar207._0_4_;
                auVar98 = vfmadd132ps_fma(auVar207,auVar98,local_9e0._0_16_);
                auVar98 = vfmadd132ps_fma(_local_880,auVar98,local_9a0._0_16_);
                auVar208._0_4_ = auVar98._0_4_ * (float)local_8a0._0_4_;
                auVar208._4_4_ = auVar98._4_4_ * (float)local_8a0._0_4_;
                auVar208._8_4_ = auVar98._8_4_ * (float)local_8a0._0_4_;
                auVar208._12_4_ = auVar98._12_4_ * (float)local_8a0._0_4_;
                auVar98 = vdpps_avx(auVar91,auVar98,0x7f);
                fVar252 = auVar98._0_4_;
                auVar227._0_4_ = auVar91._0_4_ * fVar252;
                auVar227._4_4_ = auVar91._4_4_ * fVar252;
                auVar227._8_4_ = auVar91._8_4_ * fVar252;
                auVar227._12_4_ = auVar91._12_4_ * fVar252;
                auVar98 = vsubps_avx(auVar208,auVar227);
                fVar252 = (float)local_8e0._0_4_ * (float)local_8c0._0_4_;
                auVar105 = vmaxss_avx(ZEXT416((uint)local_980._0_4_),
                                      ZEXT416((uint)(local_7c0._0_4_ * fVar273 * 1.9073486e-06)));
                auVar228._0_4_ = auVar98._0_4_ * fVar252;
                auVar228._4_4_ = auVar98._4_4_ * fVar252;
                auVar228._8_4_ = auVar98._8_4_ * fVar252;
                auVar228._12_4_ = auVar98._12_4_ * fVar252;
                auVar34._8_4_ = 0x80000000;
                auVar34._0_8_ = 0x8000000080000000;
                auVar34._12_4_ = 0x80000000;
                auVar107 = vxorps_avx512vl(auVar91,auVar34);
                auVar96 = vmulps_avx512vl(auVar96,auVar228);
                auVar98 = vdpps_avx(auVar107,auVar93,0x7f);
                auVar94 = vfmadd213ss_fma(auVar104,ZEXT416((uint)local_980._0_4_),auVar105);
                auVar104 = vdpps_avx(auVar3,auVar96,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar278),
                                          ZEXT416((uint)((float)local_980._0_4_ / fVar279)),auVar94)
                ;
                fVar278 = auVar98._0_4_ + auVar104._0_4_;
                auVar104 = vdpps_avx(local_a10,auVar93,0x7f);
                auVar98 = vdpps_avx(auVar3,auVar107,0x7f);
                auVar94 = vmulss_avx512f(auVar106,auVar92);
                auVar97 = vaddss_avx512f(auVar97,ZEXT416((uint)(auVar94._0_4_ *
                                                               auVar92._0_4_ * auVar92._0_4_)));
                auVar94 = vdpps_avx(auVar3,local_a10,0x7f);
                auVar93 = vfnmadd231ss_fma(auVar98,auVar95,ZEXT416((uint)fVar278));
                auVar94 = vfnmadd231ss_fma(auVar94,auVar95,auVar104);
                auVar98 = vpermilps_avx(local_860._0_16_,0xff);
                fVar251 = fVar251 - auVar98._0_4_;
                auVar92 = vshufps_avx(auVar91,auVar91,0xff);
                auVar98 = vfmsub213ss_fma(auVar93,auVar97,auVar92);
                auVar275._8_4_ = 0x80000000;
                auVar275._0_8_ = 0x8000000080000000;
                auVar275._12_4_ = 0x80000000;
                auVar277 = ZEXT1664(auVar275);
                auVar270._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
                auVar270._8_4_ = auVar98._8_4_ ^ 0x80000000;
                auVar270._12_4_ = auVar98._12_4_ ^ 0x80000000;
                auVar272 = ZEXT1664(auVar270);
                auVar94 = ZEXT416((uint)(auVar94._0_4_ * auVar97._0_4_));
                auVar93 = vfmsub231ss_fma(ZEXT416((uint)(auVar104._0_4_ * auVar98._0_4_)),
                                          ZEXT416((uint)fVar278),auVar94);
                auVar98 = vinsertps_avx(auVar270,auVar94,0x1c);
                auVar261._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                auVar261._8_4_ = auVar104._8_4_ ^ 0x80000000;
                auVar261._12_4_ = auVar104._12_4_ ^ 0x80000000;
                auVar94 = vinsertps_avx(ZEXT416((uint)fVar278),auVar261,0x10);
                auVar246._0_4_ = auVar93._0_4_;
                auVar246._4_4_ = auVar246._0_4_;
                auVar246._8_4_ = auVar246._0_4_;
                auVar246._12_4_ = auVar246._0_4_;
                auVar104 = vdivps_avx(auVar98,auVar246);
                auVar98 = vdivps_avx(auVar94,auVar246);
                auVar247._0_4_ = fVar280 * auVar104._0_4_ + fVar251 * auVar98._0_4_;
                auVar247._4_4_ = fVar280 * auVar104._4_4_ + fVar251 * auVar98._4_4_;
                auVar247._8_4_ = fVar280 * auVar104._8_4_ + fVar251 * auVar98._8_4_;
                auVar247._12_4_ = fVar280 * auVar104._12_4_ + fVar251 * auVar98._12_4_;
                auVar104 = vsubps_avx(auVar283,auVar247);
                auVar189 = ZEXT1664(auVar104);
                auVar35._8_4_ = 0x7fffffff;
                auVar35._0_8_ = 0x7fffffff7fffffff;
                auVar35._12_4_ = 0x7fffffff;
                auVar98 = vandps_avx512vl(auVar95,auVar35);
              } while (auVar96._0_4_ <= auVar98._0_4_);
              auVar98 = vfmadd231ss_fma(ZEXT416((uint)(auVar96._0_4_ + auVar105._0_4_)),local_940,
                                        ZEXT416(0x36000000));
              auVar36._8_4_ = 0x7fffffff;
              auVar36._0_8_ = 0x7fffffff7fffffff;
              auVar36._12_4_ = 0x7fffffff;
              auVar95 = vandps_avx512vl(ZEXT416((uint)fVar251),auVar36);
            } while (auVar98._0_4_ <= auVar95._0_4_);
            fVar273 = auVar104._0_4_ + (float)local_950._0_4_;
            if (fVar2 <= fVar273) {
              fVar278 = *(float *)(ray + k * 4 + 0x200);
              if (fVar273 <= fVar278) {
                auVar98 = vmovshdup_avx(auVar104);
                fVar279 = auVar98._0_4_;
                if ((0.0 <= fVar279) && (fVar279 <= 1.0)) {
                  auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a40._0_4_));
                  fVar280 = auVar98._0_4_;
                  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    fVar280 = fVar280 * 1.5 + local_a40._0_4_ * -0.5 * fVar280 * fVar280 * fVar280;
                    auVar248._0_4_ = auVar3._0_4_ * fVar280;
                    auVar248._4_4_ = auVar3._4_4_ * fVar280;
                    auVar248._8_4_ = auVar3._8_4_ * fVar280;
                    auVar248._12_4_ = auVar3._12_4_ * fVar280;
                    auVar92 = vfmadd213ps_fma(auVar92,auVar248,auVar91);
                    auVar98 = vshufps_avx(auVar248,auVar248,0xc9);
                    auVar95 = vshufps_avx(auVar91,auVar91,0xc9);
                    auVar249._0_4_ = auVar248._0_4_ * auVar95._0_4_;
                    auVar249._4_4_ = auVar248._4_4_ * auVar95._4_4_;
                    auVar249._8_4_ = auVar248._8_4_ * auVar95._8_4_;
                    auVar249._12_4_ = auVar248._12_4_ * auVar95._12_4_;
                    auVar94 = vfmsub231ps_fma(auVar249,auVar91,auVar98);
                    auVar98 = vshufps_avx(auVar94,auVar94,0xc9);
                    auVar95 = vshufps_avx(auVar92,auVar92,0xc9);
                    auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                    auVar179._0_4_ = auVar92._0_4_ * auVar94._0_4_;
                    auVar179._4_4_ = auVar92._4_4_ * auVar94._4_4_;
                    auVar179._8_4_ = auVar92._8_4_ * auVar94._8_4_;
                    auVar179._12_4_ = auVar92._12_4_ * auVar94._12_4_;
                    auVar98 = vfmsub231ps_fma(auVar179,auVar98,auVar95);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar273;
                      uVar196 = vextractps_avx(auVar98,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar196;
                      uVar196 = vextractps_avx(auVar98,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar196;
                      *(int *)(ray + k * 4 + 0x380) = auVar98._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar279;
                      *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                      *(int *)(ray + k * 4 + 0x440) = (int)local_a48;
                      *(uint *)(ray + k * 4 + 0x480) = uVar4;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar9 = context->user;
                      auVar162 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar162,auVar189);
                      auVar162 = vpermps_avx512f(auVar162,ZEXT1664(auVar98));
                      auVar264 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar264,ZEXT1664(auVar98));
                      local_380 = vbroadcastss_avx512f(auVar98);
                      local_400[0] = (RTCHitN)auVar162[0];
                      local_400[1] = (RTCHitN)auVar162[1];
                      local_400[2] = (RTCHitN)auVar162[2];
                      local_400[3] = (RTCHitN)auVar162[3];
                      local_400[4] = (RTCHitN)auVar162[4];
                      local_400[5] = (RTCHitN)auVar162[5];
                      local_400[6] = (RTCHitN)auVar162[6];
                      local_400[7] = (RTCHitN)auVar162[7];
                      local_400[8] = (RTCHitN)auVar162[8];
                      local_400[9] = (RTCHitN)auVar162[9];
                      local_400[10] = (RTCHitN)auVar162[10];
                      local_400[0xb] = (RTCHitN)auVar162[0xb];
                      local_400[0xc] = (RTCHitN)auVar162[0xc];
                      local_400[0xd] = (RTCHitN)auVar162[0xd];
                      local_400[0xe] = (RTCHitN)auVar162[0xe];
                      local_400[0xf] = (RTCHitN)auVar162[0xf];
                      local_400[0x10] = (RTCHitN)auVar162[0x10];
                      local_400[0x11] = (RTCHitN)auVar162[0x11];
                      local_400[0x12] = (RTCHitN)auVar162[0x12];
                      local_400[0x13] = (RTCHitN)auVar162[0x13];
                      local_400[0x14] = (RTCHitN)auVar162[0x14];
                      local_400[0x15] = (RTCHitN)auVar162[0x15];
                      local_400[0x16] = (RTCHitN)auVar162[0x16];
                      local_400[0x17] = (RTCHitN)auVar162[0x17];
                      local_400[0x18] = (RTCHitN)auVar162[0x18];
                      local_400[0x19] = (RTCHitN)auVar162[0x19];
                      local_400[0x1a] = (RTCHitN)auVar162[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar162[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar162[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar162[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar162[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar162[0x1f];
                      local_400[0x20] = (RTCHitN)auVar162[0x20];
                      local_400[0x21] = (RTCHitN)auVar162[0x21];
                      local_400[0x22] = (RTCHitN)auVar162[0x22];
                      local_400[0x23] = (RTCHitN)auVar162[0x23];
                      local_400[0x24] = (RTCHitN)auVar162[0x24];
                      local_400[0x25] = (RTCHitN)auVar162[0x25];
                      local_400[0x26] = (RTCHitN)auVar162[0x26];
                      local_400[0x27] = (RTCHitN)auVar162[0x27];
                      local_400[0x28] = (RTCHitN)auVar162[0x28];
                      local_400[0x29] = (RTCHitN)auVar162[0x29];
                      local_400[0x2a] = (RTCHitN)auVar162[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar162[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar162[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar162[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar162[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar162[0x2f];
                      local_400[0x30] = (RTCHitN)auVar162[0x30];
                      local_400[0x31] = (RTCHitN)auVar162[0x31];
                      local_400[0x32] = (RTCHitN)auVar162[0x32];
                      local_400[0x33] = (RTCHitN)auVar162[0x33];
                      local_400[0x34] = (RTCHitN)auVar162[0x34];
                      local_400[0x35] = (RTCHitN)auVar162[0x35];
                      local_400[0x36] = (RTCHitN)auVar162[0x36];
                      local_400[0x37] = (RTCHitN)auVar162[0x37];
                      local_400[0x38] = (RTCHitN)auVar162[0x38];
                      local_400[0x39] = (RTCHitN)auVar162[0x39];
                      local_400[0x3a] = (RTCHitN)auVar162[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar162[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar162[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar162[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar162[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar162[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar162 = vmovdqa64_avx512f(local_440);
                      local_280 = vmovdqa64_avx512f(auVar162);
                      auVar123 = vpcmpeqd_avx2(auVar162._0_32_,auVar162._0_32_);
                      local_a50[3] = auVar123;
                      local_a50[2] = auVar123;
                      local_a50[1] = auVar123;
                      *local_a50 = auVar123;
                      local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar273;
                      auVar162 = vmovdqa64_avx512f(local_4c0);
                      local_780 = vmovdqa64_avx512f(auVar162);
                      local_af0.valid = (int *)local_780;
                      local_af0.geometryUserPtr = pGVar5->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = local_400;
                      local_af0.N = 0x10;
                      local_af0.ray = (RTCRayN *)ray;
                      if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar272 = ZEXT1664(auVar270);
                        auVar277 = ZEXT1664(auVar275);
                        auVar189 = ZEXT1664(auVar104);
                        auVar286 = ZEXT1664(auVar3);
                        auVar289 = ZEXT1664(local_a40._0_16_);
                        auVar294 = ZEXT1664(auVar91);
                        (*pGVar5->intersectionFilterN)(&local_af0);
                        auVar123 = vmovdqa64_avx512vl(auVar110);
                        auVar303 = ZEXT3264(auVar123);
                        auVar123 = vmovdqa64_avx512vl(auVar109);
                        auVar302 = ZEXT3264(auVar123);
                        auVar162 = vmovdqa64_avx512f(local_780);
                      }
                      uVar26 = vptestmd_avx512f(auVar162,auVar162);
                      if ((short)uVar26 != 0) {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar272 = ZEXT1664(auVar272._0_16_);
                          auVar277 = ZEXT1664(auVar277._0_16_);
                          auVar189 = ZEXT1664(auVar189._0_16_);
                          auVar286 = ZEXT1664(auVar286._0_16_);
                          auVar289 = ZEXT1664(auVar289._0_16_);
                          auVar294 = ZEXT1664(auVar294._0_16_);
                          (*p_Var10)(&local_af0);
                          auVar123 = vmovdqa64_avx512vl(auVar110);
                          auVar303 = ZEXT3264(auVar123);
                          auVar123 = vmovdqa64_avx512vl(auVar109);
                          auVar302 = ZEXT3264(auVar123);
                          auVar162 = vmovdqa64_avx512f(local_780);
                        }
                        uVar83 = vptestmd_avx512f(auVar162,auVar162);
                        if ((short)uVar83 != 0) {
                          iVar54 = *(int *)(local_af0.hit + 4);
                          iVar55 = *(int *)(local_af0.hit + 8);
                          iVar56 = *(int *)(local_af0.hit + 0xc);
                          iVar57 = *(int *)(local_af0.hit + 0x10);
                          iVar58 = *(int *)(local_af0.hit + 0x14);
                          iVar59 = *(int *)(local_af0.hit + 0x18);
                          iVar60 = *(int *)(local_af0.hit + 0x1c);
                          iVar61 = *(int *)(local_af0.hit + 0x20);
                          iVar62 = *(int *)(local_af0.hit + 0x24);
                          iVar63 = *(int *)(local_af0.hit + 0x28);
                          iVar64 = *(int *)(local_af0.hit + 0x2c);
                          iVar65 = *(int *)(local_af0.hit + 0x30);
                          iVar66 = *(int *)(local_af0.hit + 0x34);
                          iVar67 = *(int *)(local_af0.hit + 0x38);
                          iVar68 = *(int *)(local_af0.hit + 0x3c);
                          bVar73 = (byte)uVar83;
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar75 = (byte)(uVar83 >> 8);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x300) =
                               (uint)(bVar73 & 1) * *(int *)local_af0.hit |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x300);
                          *(uint *)(local_af0.ray + 0x304) =
                               (uint)bVar82 * iVar54 |
                               (uint)!bVar82 * *(int *)(local_af0.ray + 0x304);
                          *(uint *)(local_af0.ray + 0x308) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x308);
                          *(uint *)(local_af0.ray + 0x30c) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x30c);
                          *(uint *)(local_af0.ray + 0x310) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x310);
                          *(uint *)(local_af0.ray + 0x314) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x314);
                          *(uint *)(local_af0.ray + 0x318) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x318);
                          *(uint *)(local_af0.ray + 0x31c) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x31c);
                          *(uint *)(local_af0.ray + 800) =
                               (uint)(bVar75 & 1) * iVar61 |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 800);
                          *(uint *)(local_af0.ray + 0x324) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x324);
                          *(uint *)(local_af0.ray + 0x328) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x328);
                          *(uint *)(local_af0.ray + 0x32c) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x32c);
                          *(uint *)(local_af0.ray + 0x330) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x330);
                          *(uint *)(local_af0.ray + 0x334) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x334);
                          *(uint *)(local_af0.ray + 0x338) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x338);
                          *(uint *)(local_af0.ray + 0x33c) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x33c);
                          iVar54 = *(int *)(local_af0.hit + 0x44);
                          iVar55 = *(int *)(local_af0.hit + 0x48);
                          iVar56 = *(int *)(local_af0.hit + 0x4c);
                          iVar57 = *(int *)(local_af0.hit + 0x50);
                          iVar58 = *(int *)(local_af0.hit + 0x54);
                          iVar59 = *(int *)(local_af0.hit + 0x58);
                          iVar60 = *(int *)(local_af0.hit + 0x5c);
                          iVar61 = *(int *)(local_af0.hit + 0x60);
                          iVar62 = *(int *)(local_af0.hit + 100);
                          iVar63 = *(int *)(local_af0.hit + 0x68);
                          iVar64 = *(int *)(local_af0.hit + 0x6c);
                          iVar65 = *(int *)(local_af0.hit + 0x70);
                          iVar66 = *(int *)(local_af0.hit + 0x74);
                          iVar67 = *(int *)(local_af0.hit + 0x78);
                          iVar68 = *(int *)(local_af0.hit + 0x7c);
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x340) =
                               (uint)(bVar73 & 1) * *(int *)(local_af0.hit + 0x40) |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x340);
                          *(uint *)(local_af0.ray + 0x344) =
                               (uint)bVar82 * iVar54 |
                               (uint)!bVar82 * *(int *)(local_af0.ray + 0x344);
                          *(uint *)(local_af0.ray + 0x348) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x348);
                          *(uint *)(local_af0.ray + 0x34c) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x34c);
                          *(uint *)(local_af0.ray + 0x350) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x350);
                          *(uint *)(local_af0.ray + 0x354) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x354);
                          *(uint *)(local_af0.ray + 0x358) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x358);
                          *(uint *)(local_af0.ray + 0x35c) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x35c);
                          *(uint *)(local_af0.ray + 0x360) =
                               (uint)(bVar75 & 1) * iVar61 |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x360);
                          *(uint *)(local_af0.ray + 0x364) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x364);
                          *(uint *)(local_af0.ray + 0x368) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x368);
                          *(uint *)(local_af0.ray + 0x36c) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x36c);
                          *(uint *)(local_af0.ray + 0x370) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x370);
                          *(uint *)(local_af0.ray + 0x374) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x374);
                          *(uint *)(local_af0.ray + 0x378) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x378);
                          *(uint *)(local_af0.ray + 0x37c) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x37c);
                          iVar54 = *(int *)(local_af0.hit + 0x84);
                          iVar55 = *(int *)(local_af0.hit + 0x88);
                          iVar56 = *(int *)(local_af0.hit + 0x8c);
                          iVar57 = *(int *)(local_af0.hit + 0x90);
                          iVar58 = *(int *)(local_af0.hit + 0x94);
                          iVar59 = *(int *)(local_af0.hit + 0x98);
                          iVar60 = *(int *)(local_af0.hit + 0x9c);
                          iVar61 = *(int *)(local_af0.hit + 0xa0);
                          iVar62 = *(int *)(local_af0.hit + 0xa4);
                          iVar63 = *(int *)(local_af0.hit + 0xa8);
                          iVar64 = *(int *)(local_af0.hit + 0xac);
                          iVar65 = *(int *)(local_af0.hit + 0xb0);
                          iVar66 = *(int *)(local_af0.hit + 0xb4);
                          iVar67 = *(int *)(local_af0.hit + 0xb8);
                          iVar68 = *(int *)(local_af0.hit + 0xbc);
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x380) =
                               (uint)(bVar73 & 1) * *(int *)(local_af0.hit + 0x80) |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x380);
                          *(uint *)(local_af0.ray + 900) =
                               (uint)bVar82 * iVar54 | (uint)!bVar82 * *(int *)(local_af0.ray + 900)
                          ;
                          *(uint *)(local_af0.ray + 0x388) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x388);
                          *(uint *)(local_af0.ray + 0x38c) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x38c);
                          *(uint *)(local_af0.ray + 0x390) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x390);
                          *(uint *)(local_af0.ray + 0x394) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x394);
                          *(uint *)(local_af0.ray + 0x398) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x398);
                          *(uint *)(local_af0.ray + 0x39c) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x39c);
                          *(uint *)(local_af0.ray + 0x3a0) =
                               (uint)(bVar75 & 1) * iVar61 |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x3a0);
                          *(uint *)(local_af0.ray + 0x3a4) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x3a4);
                          *(uint *)(local_af0.ray + 0x3a8) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x3a8);
                          *(uint *)(local_af0.ray + 0x3ac) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x3ac);
                          *(uint *)(local_af0.ray + 0x3b0) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x3b0);
                          *(uint *)(local_af0.ray + 0x3b4) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x3b4);
                          *(uint *)(local_af0.ray + 0x3b8) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x3b8);
                          *(uint *)(local_af0.ray + 0x3bc) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x3bc);
                          iVar54 = *(int *)(local_af0.hit + 0xc4);
                          iVar55 = *(int *)(local_af0.hit + 200);
                          iVar56 = *(int *)(local_af0.hit + 0xcc);
                          iVar57 = *(int *)(local_af0.hit + 0xd0);
                          iVar58 = *(int *)(local_af0.hit + 0xd4);
                          iVar59 = *(int *)(local_af0.hit + 0xd8);
                          iVar60 = *(int *)(local_af0.hit + 0xdc);
                          iVar61 = *(int *)(local_af0.hit + 0xe0);
                          iVar62 = *(int *)(local_af0.hit + 0xe4);
                          iVar63 = *(int *)(local_af0.hit + 0xe8);
                          iVar64 = *(int *)(local_af0.hit + 0xec);
                          iVar65 = *(int *)(local_af0.hit + 0xf0);
                          iVar66 = *(int *)(local_af0.hit + 0xf4);
                          iVar67 = *(int *)(local_af0.hit + 0xf8);
                          iVar68 = *(int *)(local_af0.hit + 0xfc);
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x3c0) =
                               (uint)(bVar73 & 1) * *(int *)(local_af0.hit + 0xc0) |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x3c0);
                          *(uint *)(local_af0.ray + 0x3c4) =
                               (uint)bVar82 * iVar54 |
                               (uint)!bVar82 * *(int *)(local_af0.ray + 0x3c4);
                          *(uint *)(local_af0.ray + 0x3c8) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x3c8);
                          *(uint *)(local_af0.ray + 0x3cc) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x3cc);
                          *(uint *)(local_af0.ray + 0x3d0) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x3d0);
                          *(uint *)(local_af0.ray + 0x3d4) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x3d4);
                          *(uint *)(local_af0.ray + 0x3d8) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x3d8);
                          *(uint *)(local_af0.ray + 0x3dc) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x3dc);
                          *(uint *)(local_af0.ray + 0x3e0) =
                               (uint)(bVar75 & 1) * iVar61 |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x3e0);
                          *(uint *)(local_af0.ray + 0x3e4) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x3e4);
                          *(uint *)(local_af0.ray + 1000) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 1000);
                          *(uint *)(local_af0.ray + 0x3ec) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x3ec);
                          *(uint *)(local_af0.ray + 0x3f0) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x3f0);
                          *(uint *)(local_af0.ray + 0x3f4) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x3f4);
                          *(uint *)(local_af0.ray + 0x3f8) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x3f8);
                          *(uint *)(local_af0.ray + 0x3fc) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x3fc);
                          iVar54 = *(int *)(local_af0.hit + 0x104);
                          iVar55 = *(int *)(local_af0.hit + 0x108);
                          iVar56 = *(int *)(local_af0.hit + 0x10c);
                          iVar57 = *(int *)(local_af0.hit + 0x110);
                          iVar58 = *(int *)(local_af0.hit + 0x114);
                          iVar59 = *(int *)(local_af0.hit + 0x118);
                          iVar60 = *(int *)(local_af0.hit + 0x11c);
                          iVar61 = *(int *)(local_af0.hit + 0x120);
                          iVar62 = *(int *)(local_af0.hit + 0x124);
                          iVar63 = *(int *)(local_af0.hit + 0x128);
                          iVar64 = *(int *)(local_af0.hit + 300);
                          iVar65 = *(int *)(local_af0.hit + 0x130);
                          iVar66 = *(int *)(local_af0.hit + 0x134);
                          iVar67 = *(int *)(local_af0.hit + 0x138);
                          iVar68 = *(int *)(local_af0.hit + 0x13c);
                          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar83 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar83 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar83 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar83 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar83 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar83 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar83 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar83 >> 0xe) & 1);
                          bVar23 = SUB81(uVar83 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x400) =
                               (uint)(bVar73 & 1) * *(int *)(local_af0.hit + 0x100) |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x400);
                          *(uint *)(local_af0.ray + 0x404) =
                               (uint)bVar82 * iVar54 |
                               (uint)!bVar82 * *(int *)(local_af0.ray + 0x404);
                          *(uint *)(local_af0.ray + 0x408) =
                               (uint)bVar11 * iVar55 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x408);
                          *(uint *)(local_af0.ray + 0x40c) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x40c);
                          *(uint *)(local_af0.ray + 0x410) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x410);
                          *(uint *)(local_af0.ray + 0x414) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x414);
                          *(uint *)(local_af0.ray + 0x418) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x418);
                          *(uint *)(local_af0.ray + 0x41c) =
                               (uint)bVar16 * iVar60 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x41c);
                          *(uint *)(local_af0.ray + 0x420) =
                               (uint)(bVar75 & 1) * iVar61 |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_af0.ray + 0x420);
                          *(uint *)(local_af0.ray + 0x424) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x424);
                          *(uint *)(local_af0.ray + 0x428) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x428);
                          *(uint *)(local_af0.ray + 0x42c) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x42c);
                          *(uint *)(local_af0.ray + 0x430) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x430);
                          *(uint *)(local_af0.ray + 0x434) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x434);
                          *(uint *)(local_af0.ray + 0x438) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x438);
                          *(uint *)(local_af0.ray + 0x43c) =
                               (uint)bVar23 * iVar68 |
                               (uint)!bVar23 * *(int *)(local_af0.ray + 0x43c);
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x140)
                                                      );
                          auVar162 = vmovdqu32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_af0.ray + 0x440) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x180)
                                                      );
                          auVar162 = vmovdqu32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_af0.ray + 0x480) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x1c0)
                                                      );
                          auVar162 = vmovdqa32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_af0.ray + 0x4c0) = auVar162;
                          auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x200)
                                                      );
                          auVar162 = vmovdqa32_avx512f(auVar162);
                          *(undefined1 (*) [64])(local_af0.ray + 0x500) = auVar162;
                          goto LAB_018dd3a5;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar278;
                    }
                  }
                }
              }
            }
LAB_018dd3a5:
            uVar196 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar263._4_4_ = uVar196;
            auVar263._0_4_ = uVar196;
            auVar263._8_4_ = uVar196;
            auVar263._12_4_ = uVar196;
            auVar263._16_4_ = uVar196;
            auVar263._20_4_ = uVar196;
            auVar263._24_4_ = uVar196;
            auVar263._28_4_ = uVar196;
            auVar162 = ZEXT3264(auVar263);
            auVar70._4_4_ = fStack_6fc;
            auVar70._0_4_ = local_700;
            auVar70._8_4_ = fStack_6f8;
            auVar70._12_4_ = fStack_6f4;
            auVar70._16_4_ = fStack_6f0;
            auVar70._20_4_ = fStack_6ec;
            auVar70._24_4_ = fStack_6e8;
            auVar70._28_4_ = fStack_6e4;
            uVar26 = vcmpps_avx512vl(auVar263,auVar70,0xd);
            bVar79 = ~('\x01' << ((byte)iVar30 & 0x1f)) & bVar79 & (byte)uVar26;
          }
          uVar29 = vpcmpd_avx512vl(local_6c0,local_640,1);
          uVar28 = vpcmpd_avx512vl(local_6c0,_local_720,1);
          auVar211._0_4_ = (float)local_7e0._0_4_ + (float)local_540._0_4_;
          auVar211._4_4_ = (float)local_7e0._4_4_ + (float)local_540._4_4_;
          auVar211._8_4_ = fStack_7d8 + fStack_538;
          auVar211._12_4_ = fStack_7d4 + fStack_534;
          auVar211._16_4_ = fStack_7d0 + fStack_530;
          auVar211._20_4_ = fStack_7cc + fStack_52c;
          auVar211._24_4_ = fStack_7c8 + fStack_528;
          auVar211._28_4_ = fStack_7c4 + fStack_524;
          uVar196 = auVar162._0_4_;
          auVar229._4_4_ = uVar196;
          auVar229._0_4_ = uVar196;
          auVar229._8_4_ = uVar196;
          auVar229._12_4_ = uVar196;
          auVar229._16_4_ = uVar196;
          auVar229._20_4_ = uVar196;
          auVar229._24_4_ = uVar196;
          auVar229._28_4_ = uVar196;
          uVar26 = vcmpps_avx512vl(auVar211,auVar229,2);
          bVar78 = bVar78 & (byte)uVar29 & (byte)uVar26;
          auVar250._0_4_ = (float)local_7e0._0_4_ + local_680._0_4_;
          auVar250._4_4_ = (float)local_7e0._4_4_ + local_680._4_4_;
          auVar250._8_4_ = fStack_7d8 + local_680._8_4_;
          auVar250._12_4_ = fStack_7d4 + local_680._12_4_;
          auVar250._16_4_ = fStack_7d0 + local_680._16_4_;
          auVar250._20_4_ = fStack_7cc + local_680._20_4_;
          auVar250._24_4_ = fStack_7c8 + local_680._24_4_;
          auVar250._28_4_ = fStack_7c4 + local_680._28_4_;
          uVar26 = vcmpps_avx512vl(auVar250,auVar229,2);
          bVar72 = bVar72 & (byte)uVar28 & (byte)uVar26 | bVar78;
          if (bVar72 != 0) {
            abStack_1a0[uVar77 * 0x60] = bVar72;
            auVar160._0_4_ =
                 (uint)(bVar78 & 1) * local_540._0_4_ |
                 (uint)!(bool)(bVar78 & 1) * (int)local_680._0_4_;
            bVar82 = (bool)(bVar78 >> 1 & 1);
            auVar160._4_4_ = (uint)bVar82 * local_540._4_4_ | (uint)!bVar82 * (int)local_680._4_4_;
            bVar82 = (bool)(bVar78 >> 2 & 1);
            auVar160._8_4_ = (uint)bVar82 * (int)fStack_538 | (uint)!bVar82 * (int)local_680._8_4_;
            bVar82 = (bool)(bVar78 >> 3 & 1);
            auVar160._12_4_ = (uint)bVar82 * (int)fStack_534 | (uint)!bVar82 * (int)local_680._12_4_
            ;
            bVar82 = (bool)(bVar78 >> 4 & 1);
            auVar160._16_4_ = (uint)bVar82 * (int)fStack_530 | (uint)!bVar82 * (int)local_680._16_4_
            ;
            bVar82 = (bool)(bVar78 >> 5 & 1);
            auVar160._20_4_ = (uint)bVar82 * (int)fStack_52c | (uint)!bVar82 * (int)local_680._20_4_
            ;
            auVar160._24_4_ =
                 (uint)(bVar78 >> 6) * (int)fStack_528 |
                 (uint)!(bool)(bVar78 >> 6) * (int)local_680._24_4_;
            auVar160._28_4_ = local_680._28_4_;
            *(undefined1 (*) [32])(auStack_180 + uVar77 * 0x60) = auVar160;
            uVar83 = vmovlps_avx(local_6d0);
            (&uStack_160)[uVar77 * 0xc] = uVar83;
            aiStack_158[uVar77 * 0x18] = iVar80 + 1;
            uVar77 = (ulong)((int)uVar77 + 1);
          }
        }
        auVar264 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar84 = (uint)uVar77;
      uVar77 = (ulong)(uVar84 - 1);
      if (uVar84 == 0) {
        uVar196 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar37._4_4_ = uVar196;
        auVar37._0_4_ = uVar196;
        auVar37._8_4_ = uVar196;
        auVar37._12_4_ = uVar196;
        uVar26 = vcmpps_avx512vl(local_6e0,auVar37,2);
        local_8e8 = (ulong)((uint)uVar26 & (uint)local_8e8 - 1 & (uint)local_8e8);
        goto LAB_018dacf3;
      }
      lVar76 = uVar77 * 0x60;
      auVar123 = *(undefined1 (*) [32])(auStack_180 + lVar76);
      auVar212._0_4_ = auVar123._0_4_ + (float)local_7e0._0_4_;
      auVar212._4_4_ = auVar123._4_4_ + (float)local_7e0._4_4_;
      auVar212._8_4_ = auVar123._8_4_ + fStack_7d8;
      auVar212._12_4_ = auVar123._12_4_ + fStack_7d4;
      auVar212._16_4_ = auVar123._16_4_ + fStack_7d0;
      auVar212._20_4_ = auVar123._20_4_ + fStack_7cc;
      auVar212._24_4_ = auVar123._24_4_ + fStack_7c8;
      auVar212._28_4_ = auVar123._28_4_ + fStack_7c4;
      uVar196 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar41._4_4_ = uVar196;
      auVar41._0_4_ = uVar196;
      auVar41._8_4_ = uVar196;
      auVar41._12_4_ = uVar196;
      auVar41._16_4_ = uVar196;
      auVar41._20_4_ = uVar196;
      auVar41._24_4_ = uVar196;
      auVar41._28_4_ = uVar196;
      uVar26 = vcmpps_avx512vl(auVar212,auVar41,2);
      uVar163 = (uint)uVar26 & (uint)abStack_1a0[lVar76];
    } while (uVar163 == 0);
    uVar83 = (&uStack_160)[uVar77 * 0xc];
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar83;
    auVar230._8_4_ = 0x7f800000;
    auVar230._0_8_ = 0x7f8000007f800000;
    auVar230._12_4_ = 0x7f800000;
    auVar230._16_4_ = 0x7f800000;
    auVar230._20_4_ = 0x7f800000;
    auVar230._24_4_ = 0x7f800000;
    auVar230._28_4_ = 0x7f800000;
    auVar120 = vblendmps_avx512vl(auVar230,auVar123);
    bVar72 = (byte)uVar163;
    auVar161._0_4_ =
         (uint)(bVar72 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar123._0_4_;
    bVar82 = (bool)((byte)(uVar163 >> 1) & 1);
    auVar161._4_4_ = (uint)bVar82 * auVar120._4_4_ | (uint)!bVar82 * (int)auVar123._4_4_;
    bVar82 = (bool)((byte)(uVar163 >> 2) & 1);
    auVar161._8_4_ = (uint)bVar82 * auVar120._8_4_ | (uint)!bVar82 * (int)auVar123._8_4_;
    bVar82 = (bool)((byte)(uVar163 >> 3) & 1);
    auVar161._12_4_ = (uint)bVar82 * auVar120._12_4_ | (uint)!bVar82 * (int)auVar123._12_4_;
    bVar82 = (bool)((byte)(uVar163 >> 4) & 1);
    auVar161._16_4_ = (uint)bVar82 * auVar120._16_4_ | (uint)!bVar82 * (int)auVar123._16_4_;
    bVar82 = (bool)((byte)(uVar163 >> 5) & 1);
    auVar161._20_4_ = (uint)bVar82 * auVar120._20_4_ | (uint)!bVar82 * (int)auVar123._20_4_;
    bVar82 = (bool)((byte)(uVar163 >> 6) & 1);
    auVar161._24_4_ = (uint)bVar82 * auVar120._24_4_ | (uint)!bVar82 * (int)auVar123._24_4_;
    auVar161._28_4_ =
         (uVar163 >> 7) * auVar120._28_4_ | (uint)!SUB41(uVar163 >> 7,0) * (int)auVar123._28_4_;
    auVar123 = vshufps_avx(auVar161,auVar161,0xb1);
    auVar123 = vminps_avx(auVar161,auVar123);
    auVar120 = vshufpd_avx(auVar123,auVar123,5);
    auVar123 = vminps_avx(auVar123,auVar120);
    auVar120 = vpermpd_avx2(auVar123,0x4e);
    auVar123 = vminps_avx(auVar123,auVar120);
    uVar26 = vcmpps_avx512vl(auVar161,auVar123,0);
    bVar79 = (byte)uVar26 & bVar72;
    if (bVar79 != 0) {
      uVar163 = (uint)bVar79;
    }
    uVar164 = 0;
    for (; (uVar163 & 1) == 0; uVar163 = uVar163 >> 1 | 0x80000000) {
      uVar164 = uVar164 + 1;
    }
    iVar80 = aiStack_158[uVar77 * 0x18];
    bVar72 = ~('\x01' << ((byte)uVar164 & 0x1f)) & bVar72;
    abStack_1a0[lVar76] = bVar72;
    if (bVar72 == 0) {
      uVar84 = uVar84 - 1;
    }
    uVar196 = (undefined4)uVar83;
    auVar188._4_4_ = uVar196;
    auVar188._0_4_ = uVar196;
    auVar188._8_4_ = uVar196;
    auVar188._12_4_ = uVar196;
    auVar188._16_4_ = uVar196;
    auVar188._20_4_ = uVar196;
    auVar188._24_4_ = uVar196;
    auVar188._28_4_ = uVar196;
    auVar104 = vmovshdup_avx(auVar209);
    auVar104 = vsubps_avx(auVar104,auVar209);
    auVar213._0_4_ = auVar104._0_4_;
    auVar213._4_4_ = auVar213._0_4_;
    auVar213._8_4_ = auVar213._0_4_;
    auVar213._12_4_ = auVar213._0_4_;
    auVar213._16_4_ = auVar213._0_4_;
    auVar213._20_4_ = auVar213._0_4_;
    auVar213._24_4_ = auVar213._0_4_;
    auVar213._28_4_ = auVar213._0_4_;
    auVar104 = vfmadd132ps_fma(auVar213,auVar188,auVar264._0_32_);
    auVar123 = ZEXT1632(auVar104);
    local_400[0] = (RTCHitN)auVar123[0];
    local_400[1] = (RTCHitN)auVar123[1];
    local_400[2] = (RTCHitN)auVar123[2];
    local_400[3] = (RTCHitN)auVar123[3];
    local_400[4] = (RTCHitN)auVar123[4];
    local_400[5] = (RTCHitN)auVar123[5];
    local_400[6] = (RTCHitN)auVar123[6];
    local_400[7] = (RTCHitN)auVar123[7];
    local_400[8] = (RTCHitN)auVar123[8];
    local_400[9] = (RTCHitN)auVar123[9];
    local_400[10] = (RTCHitN)auVar123[10];
    local_400[0xb] = (RTCHitN)auVar123[0xb];
    local_400[0xc] = (RTCHitN)auVar123[0xc];
    local_400[0xd] = (RTCHitN)auVar123[0xd];
    local_400[0xe] = (RTCHitN)auVar123[0xe];
    local_400[0xf] = (RTCHitN)auVar123[0xf];
    local_400[0x10] = (RTCHitN)auVar123[0x10];
    local_400[0x11] = (RTCHitN)auVar123[0x11];
    local_400[0x12] = (RTCHitN)auVar123[0x12];
    local_400[0x13] = (RTCHitN)auVar123[0x13];
    local_400[0x14] = (RTCHitN)auVar123[0x14];
    local_400[0x15] = (RTCHitN)auVar123[0x15];
    local_400[0x16] = (RTCHitN)auVar123[0x16];
    local_400[0x17] = (RTCHitN)auVar123[0x17];
    local_400[0x18] = (RTCHitN)auVar123[0x18];
    local_400[0x19] = (RTCHitN)auVar123[0x19];
    local_400[0x1a] = (RTCHitN)auVar123[0x1a];
    local_400[0x1b] = (RTCHitN)auVar123[0x1b];
    local_400[0x1c] = (RTCHitN)auVar123[0x1c];
    local_400[0x1d] = (RTCHitN)auVar123[0x1d];
    local_400[0x1e] = (RTCHitN)auVar123[0x1e];
    local_400[0x1f] = (RTCHitN)auVar123[0x1f];
    local_6d0._8_8_ = 0;
    local_6d0._0_8_ = *(ulong *)(local_400 + (ulong)uVar164 * 4);
    uVar77 = (ulong)uVar84;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }